

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

void embree::sse2::InstanceIntersectorKMB<4>::intersect
               (vbool<4> *valid_i,Precalculations *pre,RayHitK<4> *ray,RayQueryContext *context,
               Primitive *prim)

{
  RayHitK<4> *pRVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  int iVar7;
  Instance *pIVar8;
  RTCRayQueryContext *pRVar9;
  AffineSpace3ff *pAVar10;
  AffineSpace3ff *pAVar11;
  AffineSpace3ff *pAVar12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ulong uVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined4 uVar24;
  int iVar25;
  RayQueryContext *pRVar26;
  undefined4 unaff_EBP;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  float fVar31;
  float fVar32;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float fVar36;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  float fVar37;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  float extraout_XMM0_Dc_05;
  uint uVar38;
  uint uVar39;
  float extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar40;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  uint uVar41;
  uint uVar42;
  float extraout_XMM0_Dd_06;
  float fVar43;
  float fVar53;
  float fVar54;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar55;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar73;
  uint uVar74;
  float fVar76;
  float fVar77;
  uint uVar78;
  float fVar79;
  float fVar80;
  uint uVar81;
  undefined1 in_XMM4 [16];
  float fVar82;
  undefined1 auVar75 [16];
  float fVar83;
  uint uVar84;
  undefined1 in_XMM5 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar98;
  uint uVar99;
  float fVar131;
  float fVar133;
  undefined1 in_XMM6 [16];
  float fVar135;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  uint uVar132;
  uint uVar134;
  uint uVar136;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar142;
  undefined1 in_XMM7 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar146;
  float fVar150;
  float fVar151;
  undefined1 in_XMM8 [16];
  float fVar152;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar160;
  undefined1 in_XMM9 [16];
  float fVar158;
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar156 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar168;
  float fVar169;
  float fVar174;
  float fVar176;
  undefined1 in_XMM11 [16];
  float fVar178;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar175;
  float fVar177;
  float fVar179;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar180;
  float fVar183;
  float fVar185;
  undefined1 in_XMM12 [16];
  float fVar184;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar194;
  float fVar196;
  undefined1 in_XMM13 [16];
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar200;
  float fVar211;
  float fVar212;
  undefined1 in_XMM14 [16];
  float fVar213;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar215;
  float fVar233;
  float fVar235;
  undefined1 auVar216 [16];
  float fVar234;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  RayQueryContext newcontext;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [8];
  undefined8 uStack_2c0;
  undefined1 local_2b8 [8];
  undefined8 uStack_2b0;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  undefined1 local_298 [8];
  undefined8 uStack_290;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [12];
  int iStack_fc;
  RTCIntersectArguments *local_f8;
  float local_e8;
  float local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  pIVar8 = prim->instance;
  uVar27 = (pIVar8->super_Geometry).mask;
  auVar44._0_4_ = -(uint)((uVar27 & *(uint *)(ray + 0x90)) == 0);
  auVar44._4_4_ = -(uint)((uVar27 & *(uint *)(ray + 0x94)) == 0);
  auVar44._8_4_ = -(uint)((uVar27 & *(uint *)(ray + 0x98)) == 0);
  auVar44._12_4_ = -(uint)((uVar27 & *(uint *)(ray + 0x9c)) == 0);
  auVar44 = ~auVar44 & (undefined1  [16])valid_i->field_0;
  uVar27 = movmskps(unaff_EBP,auVar44);
  if ((uVar27 != 0) && (pRVar9 = context->user, pRVar9->instID[0] == 0xffffffff)) {
    pRVar9->instID[0] = prim->instID_;
    pRVar9->instPrimID[0] = 0;
    if ((pIVar8->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar215 = (pIVar8->super_Geometry).fnumTimeSegments;
      _local_2c8 = ZEXT416((uint)fVar215);
      fVar31 = (pIVar8->super_Geometry).time_range.lower;
      auVar47._0_4_ = (pIVar8->super_Geometry).time_range.upper - fVar31;
      auVar86._0_4_ = *(float *)(ray + 0x70) - fVar31;
      auVar86._4_4_ = *(float *)(ray + 0x74) - fVar31;
      auVar86._8_4_ = *(float *)(ray + 0x78) - fVar31;
      auVar86._12_4_ = *(float *)(ray + 0x7c) - fVar31;
      auVar47._4_4_ = auVar47._0_4_;
      auVar47._8_4_ = auVar47._0_4_;
      auVar47._12_4_ = auVar47._0_4_;
      auVar66 = divps(auVar86,auVar47);
      fVar135 = auVar66._0_4_ * fVar215;
      fVar238 = auVar66._4_4_ * fVar215;
      fVar168 = auVar66._8_4_ * fVar215;
      fVar174 = auVar66._12_4_ * fVar215;
      pRVar26 = context;
      local_288._0_4_ = floorf(fVar168);
      uVar24 = SUB84(pRVar26,0);
      local_288._4_4_ = extraout_XMM0_Db_02;
      uStack_280._0_4_ = (float)extraout_XMM0_Dc_02;
      uStack_280._4_4_ = (float)extraout_XMM0_Dd_02;
      local_2b8._0_4_ = floorf(fVar174);
      local_2b8._4_4_ = extraout_XMM0_Db_03;
      uStack_2b0._0_4_ = (float)extraout_XMM0_Dc_03;
      uStack_2b0._4_4_ = (float)extraout_XMM0_Dd_03;
      local_2a8._0_4_ = floorf(fVar135);
      local_2a8._4_4_ = extraout_XMM0_Db_04;
      uStack_2a0._0_4_ = (float)extraout_XMM0_Dc_04;
      uStack_2a0._4_4_ = (float)extraout_XMM0_Dd_04;
      fVar31 = floorf(fVar238);
      auVar35._4_4_ = fVar31;
      auVar35._0_4_ = local_2a8._0_4_;
      auVar35._8_4_ = local_288._0_4_;
      auVar35._12_4_ = local_2b8._0_4_;
      auVar66._0_4_ = fVar215 + -1.0;
      auVar66._4_4_ = auVar66._0_4_;
      auVar66._8_4_ = auVar66._0_4_;
      auVar66._12_4_ = auVar66._0_4_;
      auVar66 = minps(auVar35,auVar66);
      auVar66 = maxps(auVar66,ZEXT816(0));
      fVar135 = fVar135 - auVar66._0_4_;
      fVar238 = fVar238 - auVar66._4_4_;
      fVar168 = fVar168 - auVar66._8_4_;
      fVar174 = fVar174 - auVar66._12_4_;
      local_108._0_4_ = (undefined4)auVar66._0_4_;
      local_108._4_4_ = (undefined4)auVar66._4_4_;
      local_108._8_4_ = (undefined4)auVar66._8_4_;
      iStack_fc = (int)auVar66._12_4_;
      lVar13 = 0;
      if ((uVar27 & 0xff) != 0) {
        for (; ((uVar27 & 0xff) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      iVar7 = *(int *)(local_108 + lVar13 * 4);
      auVar101._0_4_ = -(uint)(iVar7 == local_108._0_4_);
      auVar101._4_4_ = -(uint)(iVar7 == local_108._4_4_);
      auVar101._8_4_ = -(uint)(iVar7 == local_108._8_4_);
      auVar101._12_4_ = -(uint)(iVar7 == iStack_fc);
      auVar66 = ~auVar101 & auVar44;
      iVar25 = movmskps(uVar24,auVar66);
      if (iVar25 == 0) {
        pAVar11 = pIVar8->local2world;
        pAVar12 = pAVar11 + iVar7;
        fVar37 = (pAVar12->l).vx.field_0.m128[1];
        fVar40 = (pAVar12->l).vx.field_0.m128[2];
        local_68._4_4_ = (pAVar12->l).vx.field_0.m128[3];
        pVVar2 = &pAVar11[iVar7].p;
        fVar53 = (pVVar2->field_0).m128[1];
        fVar54 = (pVVar2->field_0).m128[2];
        local_78._4_4_ = *(float *)((long)&pVVar2->field_0 + 0xc);
        local_68._0_4_ = local_68._4_4_;
        fStack_60 = (float)local_68._4_4_;
        fStack_5c = (float)local_68._4_4_;
        local_78._0_4_ = local_78._4_4_;
        fStack_70 = (float)local_78._4_4_;
        fStack_6c = (float)local_78._4_4_;
        pAVar10 = pAVar11 + (long)iVar7 + 1;
        fVar72 = (pAVar10->l).vx.field_0.m128[1];
        fVar76 = (pAVar10->l).vx.field_0.m128[2];
        fVar215 = (pAVar10->l).vx.field_0.m128[3];
        pVVar3 = &pAVar11[(long)iVar7 + 1].p;
        local_48._4_4_ = *(undefined4 *)((long)&pVVar3->field_0 + 4);
        fVar79 = (pVVar3->field_0).m128[2];
        fVar31 = *(float *)((long)&pVVar3->field_0 + 0xc);
        pVVar4 = &pAVar11[iVar7].l.vy;
        fVar82 = (pVVar4->field_0).m128[1];
        fVar150 = (pVVar4->field_0).m128[2];
        local_58._4_4_ = *(float *)((long)&pVVar4->field_0 + 0xc);
        local_58._0_4_ = local_58._4_4_;
        fStack_50 = (float)local_58._4_4_;
        fStack_4c = (float)local_58._4_4_;
        pVVar5 = &pAVar11[(long)iVar7 + 1].l.vy;
        fVar151 = (pVVar5->field_0).m128[1];
        fVar152 = (pVVar5->field_0).m128[2];
        fVar176 = *(float *)((long)&pVVar5->field_0 + 0xc);
        pVVar6 = &pAVar11[iVar7].l.vz;
        fVar153 = (pVVar6->field_0).m128[0];
        fVar157 = (pVVar6->field_0).m128[1];
        fVar160 = (pVVar6->field_0).m128[2];
        local_88._4_4_ = (pVVar6->field_0).m128[3];
        local_88._0_4_ = local_88._4_4_;
        fStack_80 = (float)local_88._4_4_;
        fStack_7c = (float)local_88._4_4_;
        pVVar6 = &pAVar11[(long)iVar7 + 1].l.vz;
        fVar162 = (pVVar6->field_0).m128[1];
        fVar180 = (pVVar6->field_0).m128[2];
        fVar178 = *(float *)((long)&pVVar6->field_0 + 0xc);
        auVar87._0_4_ =
             (float)local_88._4_4_ * fVar178 +
             (float)local_58._4_4_ * fVar176 +
             (float)local_68._4_4_ * fVar215 + (float)local_78._4_4_ * fVar31;
        auVar87._4_4_ =
             (float)local_88._4_4_ * fVar178 +
             (float)local_58._4_4_ * fVar176 +
             (float)local_68._4_4_ * fVar215 + (float)local_78._4_4_ * fVar31;
        auVar87._8_4_ =
             (float)local_88._4_4_ * fVar178 +
             (float)local_58._4_4_ * fVar176 +
             (float)local_68._4_4_ * fVar215 + (float)local_78._4_4_ * fVar31;
        auVar87._12_4_ =
             (float)local_88._4_4_ * fVar178 +
             (float)local_58._4_4_ * fVar176 +
             (float)local_68._4_4_ * fVar215 + (float)local_78._4_4_ * fVar31;
        uVar17 = CONCAT44(auVar87._4_4_,auVar87._0_4_);
        auVar139._0_8_ = uVar17 ^ 0x8000000080000000;
        auVar139._8_4_ = -auVar87._8_4_;
        auVar139._12_4_ = -auVar87._12_4_;
        uVar27 = -(uint)(-auVar87._0_4_ <= auVar87._0_4_);
        uVar28 = -(uint)(-auVar87._4_4_ <= auVar87._4_4_);
        uVar29 = -(uint)(auVar139._8_4_ <= auVar87._8_4_);
        uVar30 = -(uint)(auVar139._12_4_ <= auVar87._12_4_);
        local_a8._4_4_ = (uint)fVar31 & uVar28 | ~uVar28 & (uint)-fVar31;
        local_a8._0_4_ = (uint)fVar31 & uVar27 | ~uVar27 & (uint)-fVar31;
        fStack_a0 = (float)((uint)fVar31 & uVar29 | ~uVar29 & (uint)-fVar31);
        fStack_9c = (float)((uint)fVar31 & uVar30 | ~uVar30 & (uint)-fVar31);
        fVar55 = (float)((uint)fVar215 & uVar27 | ~uVar27 & (uint)-fVar215);
        fVar62 = (float)((uint)fVar215 & uVar28 | ~uVar28 & (uint)-fVar215);
        fVar63 = (float)((uint)fVar215 & uVar29 | ~uVar29 & (uint)-fVar215);
        fVar64 = (float)((uint)fVar215 & uVar30 | ~uVar30 & (uint)-fVar215);
        local_98._4_4_ = (uint)fVar176 & uVar28 | ~uVar28 & (uint)-fVar176;
        local_98._0_4_ = (uint)fVar176 & uVar27 | ~uVar27 & (uint)-fVar176;
        fStack_90 = (float)((uint)fVar176 & uVar29 | ~uVar29 & (uint)-fVar176);
        fStack_8c = (float)((uint)fVar176 & uVar30 | ~uVar30 & (uint)-fVar176);
        auVar47 = maxps(auVar139,auVar87);
        fVar154 = ABS(auVar87._0_4_);
        fVar32 = ABS(auVar87._4_4_);
        fVar36 = ABS(auVar87._8_4_);
        fVar43 = ABS(auVar87._12_4_);
        fVar215 = (float)(~uVar27 & (uint)-fVar178 | (uint)fVar178 & uVar27);
        fVar176 = (float)(~uVar28 & (uint)-fVar178 | (uint)fVar178 & uVar28);
        fVar73 = (float)(~uVar29 & (uint)-fVar178 | (uint)fVar178 & uVar29);
        fVar80 = (float)(~uVar30 & (uint)-fVar178 | (uint)fVar178 & uVar30);
        auVar49._0_4_ = 1.0 - fVar154;
        auVar49._4_4_ = 1.0 - fVar32;
        auVar49._8_4_ = 1.0 - fVar36;
        auVar49._12_4_ = 1.0 - fVar43;
        auVar66 = sqrtps(auVar49,auVar49);
        fVar31 = 1.5707964 -
                 auVar66._0_4_ *
                 (((((fVar154 * -0.0043095737 + 0.0192803) * fVar154 + -0.04489909) * fVar154 +
                   0.08785567) * fVar154 + -0.21450998) * fVar154 + 1.5707952);
        fVar178 = 1.5707964 -
                  auVar66._4_4_ *
                  (((((fVar32 * -0.0043095737 + 0.0192803) * fVar32 + -0.04489909) * fVar32 +
                    0.08785567) * fVar32 + -0.21450998) * fVar32 + 1.5707952);
        fVar77 = 1.5707964 -
                 auVar66._8_4_ *
                 (((((fVar36 * -0.0043095737 + 0.0192803) * fVar36 + -0.04489909) * fVar36 +
                   0.08785567) * fVar36 + -0.21450998) * fVar36 + 1.5707952);
        fVar83 = 1.5707964 -
                 auVar66._12_4_ *
                 (((((fVar43 * -0.0043095737 + 0.0192803) * fVar43 + -0.04489909) * fVar43 +
                   0.08785567) * fVar43 + -0.21450998) * fVar43 + 1.5707952);
        uVar27 = -(uint)(0.0 <= fVar31) & (uint)fVar31;
        uVar28 = -(uint)(0.0 <= fVar178) & (uint)fVar178;
        uVar29 = -(uint)(0.0 <= fVar77) & (uint)fVar77;
        uVar30 = -(uint)(0.0 <= fVar83) & (uint)fVar83;
        fVar211 = auVar47._0_4_;
        fVar214 = auVar47._4_4_;
        fVar237 = auVar47._8_4_;
        fVar159 = auVar47._12_4_;
        local_248._0_4_ = SUB124(*(undefined1 (*) [12])&(pAVar12->l).vx.field_0,0);
        local_268._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar4->field_0,0);
        local_258._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar2->field_0,0);
        local_168._0_4_ = SUB124(*(undefined1 (*) [12])&(pAVar10->l).vx.field_0,0);
        local_1c8._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar5->field_0,0);
        local_1b8._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar6->field_0,0);
        local_178._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,0);
        local_48._0_4_ = local_48._4_4_;
        fStack_40 = (float)local_48._4_4_;
        fStack_3c = (float)local_48._4_4_;
        local_c8 = (float)(~-(uint)(fVar154 <= 1.0) & 0x7fc00000 |
                          (uint)(1.5707964 -
                                (float)(~-(uint)(0.0 <= fVar211) & (uVar27 ^ 0x80000000) |
                                       uVar27 & -(uint)(0.0 <= fVar211))) & -(uint)(fVar154 <= 1.0))
                   * fVar135;
        fStack_c4 = (float)(~-(uint)(fVar32 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar214) & (uVar28 ^ 0x80000000) |
                                        uVar28 & -(uint)(0.0 <= fVar214))) & -(uint)(fVar32 <= 1.0))
                    * fVar238;
        fStack_c0 = (float)(~-(uint)(fVar36 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar237) & (uVar29 ^ 0x80000000) |
                                        uVar29 & -(uint)(0.0 <= fVar237))) & -(uint)(fVar36 <= 1.0))
                    * fVar168;
        fStack_bc = (float)(~-(uint)(fVar43 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar159) & (uVar30 ^ 0x80000000) |
                                        uVar30 & -(uint)(0.0 <= fVar159))) & -(uint)(fVar43 <= 1.0))
                    * fVar174;
        fVar31 = local_c8 * 0.63661975;
        fVar178 = fStack_c4 * 0.63661975;
        fVar77 = fStack_bc * 0.63661975;
        local_b8 = floorf(fStack_c0 * 0.63661975);
        fStack_b4 = extraout_XMM0_Db_05;
        fStack_b0 = extraout_XMM0_Dc_05;
        fStack_ac = extraout_XMM0_Dd_05;
        local_d8 = floorf(fVar77);
        local_e8 = floorf(fVar31);
        fVar31 = floorf(fVar178);
        uVar27 = (uint)local_e8;
        uVar29 = (uint)fVar31;
        uVar38 = (uint)local_b8;
        uVar41 = (uint)local_d8;
        fVar178 = local_c8 - local_e8 * 1.5707964;
        fVar31 = fStack_c4 - fVar31 * 1.5707964;
        auVar147._4_4_ = fVar31;
        auVar147._0_4_ = fVar178;
        fVar77 = fStack_c0 - local_b8 * 1.5707964;
        fVar83 = fStack_bc - local_d8 * 1.5707964;
        auVar147._8_4_ = fVar77;
        auVar147._12_4_ = fVar83;
        fVar154 = fVar178 * fVar178;
        fVar32 = fVar31 * fVar31;
        fVar36 = fVar77 * fVar77;
        fVar43 = fVar83 * fVar83;
        uVar99 = -(uint)(1 < (uVar27 & 3));
        uVar132 = -(uint)(1 < (uVar29 & 3));
        uVar134 = -(uint)(1 < (uVar38 & 3));
        uVar136 = -(uint)(1 < (uVar41 & 3));
        fVar178 = (((((fVar154 * -2.5029328e-08 + 2.7600126e-06) * fVar154 + -0.00019842605) *
                     fVar154 + 0.008333348) * fVar154 + -0.16666667) * fVar154 + 1.0) * fVar178;
        fVar31 = (((((fVar32 * -2.5029328e-08 + 2.7600126e-06) * fVar32 + -0.00019842605) * fVar32 +
                   0.008333348) * fVar32 + -0.16666667) * fVar32 + 1.0) * fVar31;
        fVar77 = (((((fVar36 * -2.5029328e-08 + 2.7600126e-06) * fVar36 + -0.00019842605) * fVar36 +
                   0.008333348) * fVar36 + -0.16666667) * fVar36 + 1.0) * fVar77;
        fVar83 = (((((fVar43 * -2.5029328e-08 + 2.7600126e-06) * fVar43 + -0.00019842605) * fVar43 +
                   0.008333348) * fVar43 + -0.16666667) * fVar43 + 1.0) * fVar83;
        uVar28 = -(uint)((uVar27 & 1) == 0);
        uVar30 = -(uint)((uVar29 & 1) == 0);
        uVar39 = -(uint)((uVar38 & 1) == 0);
        uVar42 = -(uint)((uVar41 & 1) == 0);
        fVar154 = ((((fVar154 * -2.5963018e-07 + 2.4756235e-05) * fVar154 + -0.001388833) * fVar154
                   + 0.04166664) * fVar154 + -0.5) * fVar154 + 1.0;
        fVar32 = ((((fVar32 * -2.5963018e-07 + 2.4756235e-05) * fVar32 + -0.001388833) * fVar32 +
                  0.04166664) * fVar32 + -0.5) * fVar32 + 1.0;
        fVar36 = ((((fVar36 * -2.5963018e-07 + 2.4756235e-05) * fVar36 + -0.001388833) * fVar36 +
                  0.04166664) * fVar36 + -0.5) * fVar36 + 1.0;
        fVar43 = ((((fVar43 * -2.5963018e-07 + 2.4756235e-05) * fVar43 + -0.001388833) * fVar43 +
                  0.04166664) * fVar43 + -0.5) * fVar43 + 1.0;
        uVar28 = uVar28 & (uint)fVar178 | ~uVar28 & (uint)fVar154;
        uVar30 = uVar30 & (uint)fVar31 | ~uVar30 & (uint)fVar32;
        uVar39 = uVar39 & (uint)fVar77 | ~uVar39 & (uint)fVar36;
        uVar42 = uVar42 & (uint)fVar83 | ~uVar42 & (uint)fVar43;
        uVar74 = (int)(uVar27 << 0x1f) >> 0x1f;
        uVar78 = (int)(uVar29 << 0x1f) >> 0x1f;
        uVar81 = (int)(uVar38 << 0x1f) >> 0x1f;
        uVar84 = (int)(uVar41 << 0x1f) >> 0x1f;
        uVar74 = ~uVar74 & (uint)fVar154 | (uint)fVar178 & uVar74;
        uVar78 = ~uVar78 & (uint)fVar32 | (uint)fVar31 & uVar78;
        uVar81 = ~uVar81 & (uint)fVar36 | (uint)fVar77 & uVar81;
        uVar84 = ~uVar84 & (uint)fVar43 | (uint)fVar83 & uVar84;
        fVar31 = (float)((uVar28 ^ 0x80000000) & uVar99 | ~uVar99 & uVar28);
        fVar178 = (float)((uVar30 ^ 0x80000000) & uVar132 | ~uVar132 & uVar30);
        fVar77 = (float)((uVar39 ^ 0x80000000) & uVar134 | ~uVar134 & uVar39);
        fVar83 = (float)((uVar42 ^ 0x80000000) & uVar136 | ~uVar136 & uVar42);
        uVar27 = -(uint)(0x7ffffffd < (int)((uVar27 & 3) - 3 ^ 0x80000000));
        uVar28 = -(uint)(0x7ffffffd < (int)((uVar29 & 3) - 3 ^ 0x80000000));
        uVar29 = -(uint)(0x7ffffffd < (int)((uVar38 & 3) - 3 ^ 0x80000000));
        uVar30 = -(uint)(0x7ffffffd < (int)((uVar41 & 3) - 3 ^ 0x80000000));
        fVar184 = (float)((uVar74 ^ 0x80000000) & uVar27 | ~uVar27 & uVar74);
        fVar186 = (float)((uVar78 ^ 0x80000000) & uVar28 | ~uVar28 & uVar78);
        fVar188 = (float)((uVar81 ^ 0x80000000) & uVar29 | ~uVar29 & uVar81);
        fVar191 = (float)((uVar84 ^ 0x80000000) & uVar30 | ~uVar30 & uVar84);
        fVar154 = (float)local_78._0_4_ * fVar211 - (float)local_a8._0_4_;
        fVar32 = (float)local_78._4_4_ * fVar214 - (float)local_a8._4_4_;
        fVar36 = fStack_70 * fVar237 - fStack_a0;
        fVar43 = fStack_6c * fVar159 - fStack_9c;
        fVar98 = (float)local_68._0_4_ * fVar211 - fVar55;
        fVar131 = (float)local_68._4_4_ * fVar214 - fVar62;
        fVar133 = fStack_60 * fVar237 - fVar63;
        fVar146 = fStack_5c * fVar159 - fVar64;
        fVar194 = (float)local_58._0_4_ * fVar211 - (float)local_98._0_4_;
        fVar196 = (float)local_58._4_4_ * fVar214 - (float)local_98._4_4_;
        fVar198 = fStack_50 * fVar237 - fStack_90;
        fVar200 = fStack_4c * fVar159 - fStack_8c;
        fVar183 = (float)local_88._0_4_ * fVar211 - fVar215;
        fVar185 = (float)local_88._4_4_ * fVar214 - fVar176;
        fVar187 = fStack_80 * fVar237 - fVar73;
        fVar189 = fStack_7c * fVar159 - fVar80;
        auVar57._0_4_ = fVar183 * fVar183 + fVar194 * fVar194 + fVar98 * fVar98 + fVar154 * fVar154;
        auVar57._4_4_ = fVar185 * fVar185 + fVar196 * fVar196 + fVar131 * fVar131 + fVar32 * fVar32;
        auVar57._8_4_ = fVar187 * fVar187 + fVar198 * fVar198 + fVar133 * fVar133 + fVar36 * fVar36;
        auVar57._12_4_ = fVar189 * fVar189 + fVar200 * fVar200 + fVar146 * fVar146 + fVar43 * fVar43
        ;
        auVar66 = rsqrtps(auVar147,auVar57);
        fVar212 = auVar66._0_4_;
        fVar213 = auVar66._4_4_;
        fVar235 = auVar66._8_4_;
        fVar143 = auVar66._12_4_;
        fVar212 = fVar212 * 1.5 - fVar212 * fVar212 * auVar57._0_4_ * 0.5 * fVar212;
        fVar233 = fVar213 * 1.5 - fVar213 * fVar213 * auVar57._4_4_ * 0.5 * fVar213;
        fVar142 = fVar235 * 1.5 - fVar235 * fVar235 * auVar57._8_4_ * 0.5 * fVar235;
        fVar144 = fVar143 * 1.5 - fVar143 * fVar143 * auVar57._12_4_ * 0.5 * fVar143;
        fVar155 = ((float)local_a8._0_4_ - (float)local_78._0_4_) * fVar135 + (float)local_78._0_4_;
        fVar158 = ((float)local_a8._4_4_ - (float)local_78._4_4_) * fVar238 + (float)local_78._4_4_;
        fVar161 = (fStack_a0 - fStack_70) * fVar168 + fStack_70;
        fVar163 = (fStack_9c - fStack_6c) * fVar174 + fStack_6c;
        fVar213 = (fVar55 - (float)local_68._0_4_) * fVar135 + (float)local_68._0_4_;
        fVar235 = (fVar62 - (float)local_68._4_4_) * fVar238 + (float)local_68._4_4_;
        fVar143 = (fVar63 - fStack_60) * fVar168 + fStack_60;
        fVar145 = (fVar64 - fStack_5c) * fVar174 + fStack_5c;
        fVar190 = ((float)local_98._0_4_ - (float)local_58._0_4_) * fVar135 + (float)local_58._0_4_;
        fVar195 = ((float)local_98._4_4_ - (float)local_58._4_4_) * fVar238 + (float)local_58._4_4_;
        fVar197 = (fStack_90 - fStack_50) * fVar168 + fStack_50;
        fVar199 = (fStack_8c - fStack_4c) * fVar174 + fStack_4c;
        fVar169 = (fVar215 - (float)local_88._0_4_) * fVar135 + (float)local_88._0_4_;
        fVar175 = (fVar176 - (float)local_88._4_4_) * fVar238 + (float)local_88._4_4_;
        fVar177 = (fVar73 - fStack_80) * fVar168 + fStack_80;
        fVar179 = (fVar80 - fStack_7c) * fVar174 + fStack_7c;
        auVar88._0_4_ = fVar190 * fVar190 + fVar213 * fVar213 + fVar155 * fVar155;
        auVar88._4_4_ = fVar195 * fVar195 + fVar235 * fVar235 + fVar158 * fVar158;
        auVar88._8_4_ = fVar197 * fVar197 + fVar143 * fVar143 + fVar161 * fVar161;
        auVar88._12_4_ = fVar199 * fVar199 + fVar145 * fVar145 + fVar163 * fVar163;
        auVar102._0_4_ = fVar169 * fVar169 + auVar88._0_4_;
        auVar102._4_4_ = fVar175 * fVar175 + auVar88._4_4_;
        auVar102._8_4_ = fVar177 * fVar177 + auVar88._8_4_;
        auVar102._12_4_ = fVar179 * fVar179 + auVar88._12_4_;
        auVar66 = rsqrtps(auVar88,auVar102);
        fVar215 = auVar66._0_4_;
        fVar176 = auVar66._4_4_;
        fVar73 = auVar66._8_4_;
        fVar80 = auVar66._12_4_;
        fVar55 = fVar215 * 1.5 - fVar215 * fVar215 * auVar102._0_4_ * 0.5 * fVar215;
        fVar62 = fVar176 * 1.5 - fVar176 * fVar176 * auVar102._4_4_ * 0.5 * fVar176;
        fVar63 = fVar73 * 1.5 - fVar73 * fVar73 * auVar102._8_4_ * 0.5 * fVar73;
        fVar64 = fVar80 * 1.5 - fVar80 * fVar80 * auVar102._12_4_ * 0.5 * fVar80;
        uVar27 = -(uint)(fVar211 <= 0.9995);
        uVar28 = -(uint)(fVar214 <= 0.9995);
        uVar29 = -(uint)(fVar237 <= 0.9995);
        uVar30 = -(uint)(fVar159 <= 0.9995);
        fVar154 = (float)(~uVar27 & (uint)(fVar155 * fVar55) |
                         (uint)((float)local_78._0_4_ * fVar184 - fVar154 * fVar212 * fVar31) &
                         uVar27);
        fVar32 = (float)(~uVar28 & (uint)(fVar158 * fVar62) |
                        (uint)((float)local_78._4_4_ * fVar186 - fVar32 * fVar233 * fVar178) &
                        uVar28);
        fVar36 = (float)(~uVar29 & (uint)(fVar161 * fVar63) |
                        (uint)(fStack_70 * fVar188 - fVar36 * fVar142 * fVar77) & uVar29);
        fVar43 = (float)(~uVar30 & (uint)(fVar163 * fVar64) |
                        (uint)(fStack_6c * fVar191 - fVar43 * fVar144 * fVar83) & uVar30);
        fVar215 = (float)(~uVar27 & (uint)(fVar213 * fVar55) |
                         (uint)((float)local_68._0_4_ * fVar184 - fVar98 * fVar212 * fVar31) &
                         uVar27);
        fVar176 = (float)(~uVar28 & (uint)(fVar235 * fVar62) |
                         (uint)((float)local_68._4_4_ * fVar186 - fVar131 * fVar233 * fVar178) &
                         uVar28);
        fVar73 = (float)(~uVar29 & (uint)(fVar143 * fVar63) |
                        (uint)(fStack_60 * fVar188 - fVar133 * fVar142 * fVar77) & uVar29);
        fVar80 = (float)(~uVar30 & (uint)(fVar145 * fVar64) |
                        (uint)(fStack_5c * fVar191 - fVar146 * fVar144 * fVar83) & uVar30);
        fVar98 = (float)(~uVar27 & (uint)(fVar190 * fVar55) |
                        (uint)((float)local_58._0_4_ * fVar184 - fVar194 * fVar212 * fVar31) &
                        uVar27);
        fVar131 = (float)(~uVar28 & (uint)(fVar195 * fVar62) |
                         (uint)((float)local_58._4_4_ * fVar186 - fVar196 * fVar233 * fVar178) &
                         uVar28);
        fVar133 = (float)(~uVar29 & (uint)(fVar197 * fVar63) |
                         (uint)(fStack_50 * fVar188 - fVar198 * fVar142 * fVar77) & uVar29);
        fVar146 = (float)(~uVar30 & (uint)(fVar199 * fVar64) |
                         (uint)(fStack_4c * fVar191 - fVar200 * fVar144 * fVar83) & uVar30);
        fVar31 = (float)(~uVar27 & (uint)(fVar55 * fVar169) |
                        (uint)(fVar184 * (float)local_88._0_4_ - fVar212 * fVar183 * fVar31) &
                        uVar27);
        fVar178 = (float)(~uVar28 & (uint)(fVar62 * fVar175) |
                         (uint)(fVar186 * (float)local_88._4_4_ - fVar233 * fVar185 * fVar178) &
                         uVar28);
        fVar77 = (float)(~uVar29 & (uint)(fVar63 * fVar177) |
                        (uint)(fVar188 * fStack_80 - fVar142 * fVar187 * fVar77) & uVar29);
        fVar83 = (float)(~uVar30 & (uint)(fVar64 * fVar179) |
                        (uint)(fVar191 * fStack_7c - fVar144 * fVar189 * fVar83) & uVar30);
        fVar183 = 1.0 - fVar135;
        fVar185 = 1.0 - fVar238;
        fVar187 = 1.0 - fVar168;
        fVar189 = 1.0 - fVar174;
        fVar55 = (float)local_248._0_4_ * fVar183 + (float)local_168._0_4_ * fVar135;
        fVar62 = (float)local_248._0_4_ * fVar185 + (float)local_168._0_4_ * fVar238;
        fVar63 = (float)local_248._0_4_ * fVar187 + (float)local_168._0_4_ * fVar168;
        fVar64 = (float)local_248._0_4_ * fVar189 + (float)local_168._0_4_ * fVar174;
        local_2b8._4_4_ = fVar37 * fVar185 + fVar72 * fVar238;
        local_2b8._0_4_ = fVar37 * fVar183 + fVar72 * fVar135;
        uStack_2b0._0_4_ = fVar37 * fVar187 + fVar72 * fVar168;
        uStack_2b0._4_4_ = fVar37 * fVar189 + fVar72 * fVar174;
        local_2c8._4_4_ = fVar40 * fVar185 + fVar76 * fVar238;
        local_2c8._0_4_ = fVar40 * fVar183 + fVar76 * fVar135;
        uStack_2c0._0_4_ = fVar40 * fVar187 + fVar76 * fVar168;
        uStack_2c0._4_4_ = fVar40 * fVar189 + fVar76 * fVar174;
        fVar37 = (float)local_268._0_4_ * fVar187;
        fVar40 = (float)local_268._0_4_ * fVar189;
        local_268._4_4_ = (float)local_268._0_4_ * fVar185 + (float)local_1c8._0_4_ * fVar238;
        local_268._0_4_ = (float)local_268._0_4_ * fVar183 + (float)local_1c8._0_4_ * fVar135;
        fStack_260 = fVar37 + (float)local_1c8._0_4_ * fVar168;
        fStack_25c = fVar40 + (float)local_1c8._0_4_ * fVar174;
        local_2a8._4_4_ = fVar82 * fVar185 + fVar151 * fVar238;
        local_2a8._0_4_ = fVar82 * fVar183 + fVar151 * fVar135;
        uStack_2a0._0_4_ = fVar82 * fVar187 + fVar151 * fVar168;
        uStack_2a0._4_4_ = fVar82 * fVar189 + fVar151 * fVar174;
        local_298._4_4_ = fVar150 * fVar185 + fVar152 * fVar238;
        local_298._0_4_ = fVar150 * fVar183 + fVar152 * fVar135;
        uStack_290._0_4_ = fVar150 * fVar187 + fVar152 * fVar168;
        uStack_290._4_4_ = fVar150 * fVar189 + fVar152 * fVar174;
        local_288._4_4_ = fVar153 * fVar185 + (float)local_1b8._0_4_ * fVar238;
        local_288._0_4_ = fVar153 * fVar183 + (float)local_1b8._0_4_ * fVar135;
        uStack_280._0_4_ = fVar153 * fVar187 + (float)local_1b8._0_4_ * fVar168;
        uStack_280._4_4_ = fVar153 * fVar189 + (float)local_1b8._0_4_ * fVar174;
        local_1e8._4_4_ = fVar157 * fVar185 + fVar162 * fVar238;
        local_1e8._0_4_ = fVar157 * fVar183 + fVar162 * fVar135;
        fStack_1e0 = fVar157 * fVar187 + fVar162 * fVar168;
        fStack_1dc = fVar157 * fVar189 + fVar162 * fVar174;
        local_1f8._4_4_ = fVar160 * fVar185 + fVar180 * fVar238;
        local_1f8._0_4_ = fVar160 * fVar183 + fVar180 * fVar135;
        fStack_1f0 = fVar160 * fVar187 + fVar180 * fVar168;
        fStack_1ec = fVar160 * fVar189 + fVar180 * fVar174;
        fVar37 = (float)local_258._0_4_ * fVar187;
        fVar40 = (float)local_258._0_4_ * fVar189;
        local_258._4_4_ = (float)local_258._0_4_ * fVar185 + (float)local_178._0_4_ * fVar238;
        local_258._0_4_ = (float)local_258._0_4_ * fVar183 + (float)local_178._0_4_ * fVar135;
        fStack_250 = fVar37 + (float)local_178._0_4_ * fVar168;
        fStack_24c = fVar40 + (float)local_178._0_4_ * fVar174;
        local_228._4_4_ = fVar53 * fVar185 + (float)local_48._4_4_ * fVar238;
        local_228._0_4_ = fVar53 * fVar183 + (float)local_48._0_4_ * fVar135;
        fStack_220 = fVar53 * fVar187 + fStack_40 * fVar168;
        fStack_21c = fVar53 * fVar189 + fStack_3c * fVar174;
        fVar135 = fVar183 * fVar54 + fVar79 * fVar135;
        fVar238 = fVar185 * fVar54 + fVar79 * fVar238;
        fVar168 = fVar187 * fVar54 + fVar79 * fVar168;
        fVar174 = fVar189 * fVar54 + fVar79 * fVar174;
      }
      else {
        if (uVar27 != 0) {
          pAVar12 = pIVar8->local2world;
          auVar47 = auVar44;
          do {
            lVar13 = 0;
            if ((uVar27 & 0xf) != 0) {
              for (; ((uVar27 & 0xf) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            iVar7 = *(int *)(local_108 + (long)(int)lVar13 * 4);
            auVar138._0_4_ = -(uint)(iVar7 == local_108._0_4_);
            auVar138._4_4_ = -(uint)(iVar7 == local_108._4_4_);
            auVar138._8_4_ = -(uint)(iVar7 == local_108._8_4_);
            auVar138._12_4_ = -(uint)(iVar7 == iStack_fc);
            auVar138 = auVar138 & auVar47;
            pAVar10 = pAVar12 + iVar7;
            uVar24 = *(undefined4 *)&(pAVar10->l).vx.field_0;
            uVar14 = *(undefined4 *)((long)&(pAVar10->l).vx.field_0 + 4);
            uVar15 = *(undefined4 *)((long)&(pAVar10->l).vx.field_0 + 8);
            uVar16 = *(undefined4 *)((long)&(pAVar10->l).vx.field_0 + 0xc);
            auVar105._4_4_ = uVar24;
            auVar105._0_4_ = uVar24;
            auVar105._8_4_ = uVar24;
            auVar105._12_4_ = uVar24;
            _local_248 = ~auVar138 & _local_248 | auVar105 & auVar138;
            auVar106._4_4_ = uVar14;
            auVar106._0_4_ = uVar14;
            auVar106._8_4_ = uVar14;
            auVar106._12_4_ = uVar14;
            _local_2b8 = ~auVar138 & _local_2b8 | auVar106 & auVar138;
            auVar107._4_4_ = uVar15;
            auVar107._0_4_ = uVar15;
            auVar107._8_4_ = uVar15;
            auVar107._12_4_ = uVar15;
            _local_2c8 = ~auVar138 & _local_2c8 | auVar107 & auVar138;
            auVar165._4_4_ = uVar16;
            auVar165._0_4_ = uVar16;
            auVar165._8_4_ = uVar16;
            auVar165._12_4_ = uVar16;
            in_XMM13 = ~auVar138 & in_XMM13 | auVar165 & auVar138;
            pVVar2 = &pAVar12[iVar7].l.vy;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar108._4_4_ = uVar24;
            auVar108._0_4_ = uVar24;
            auVar108._8_4_ = uVar24;
            auVar108._12_4_ = uVar24;
            _local_268 = ~auVar138 & _local_268 | auVar108 & auVar138;
            auVar109._4_4_ = uVar14;
            auVar109._0_4_ = uVar14;
            auVar109._8_4_ = uVar14;
            auVar109._12_4_ = uVar14;
            _local_2a8 = ~auVar138 & _local_2a8 | auVar109 & auVar138;
            auVar110._4_4_ = uVar15;
            auVar110._0_4_ = uVar15;
            auVar110._8_4_ = uVar15;
            auVar110._12_4_ = uVar15;
            _local_298 = ~auVar138 & _local_298 | auVar110 & auVar138;
            auVar171._4_4_ = uVar16;
            auVar171._0_4_ = uVar16;
            auVar171._8_4_ = uVar16;
            auVar171._12_4_ = uVar16;
            in_XMM12 = ~auVar138 & in_XMM12 | auVar171 & auVar138;
            pVVar2 = &pAVar12[iVar7].l.vz;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar111._4_4_ = uVar24;
            auVar111._0_4_ = uVar24;
            auVar111._8_4_ = uVar24;
            auVar111._12_4_ = uVar24;
            _local_288 = ~auVar138 & _local_288 | auVar111 & auVar138;
            auVar112._4_4_ = uVar14;
            auVar112._0_4_ = uVar14;
            auVar112._8_4_ = uVar14;
            auVar112._12_4_ = uVar14;
            _local_1e8 = ~auVar138 & _local_1e8 | auVar112 & auVar138;
            auVar113._4_4_ = uVar15;
            auVar113._0_4_ = uVar15;
            auVar113._8_4_ = uVar15;
            auVar113._12_4_ = uVar15;
            _local_1f8 = ~auVar138 & _local_1f8 | auVar113 & auVar138;
            auVar91._4_4_ = uVar16;
            auVar91._0_4_ = uVar16;
            auVar91._8_4_ = uVar16;
            auVar91._12_4_ = uVar16;
            in_XMM11 = ~auVar138 & in_XMM11 | auVar91 & auVar138;
            pVVar2 = &pAVar12[iVar7].p;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar114._4_4_ = uVar24;
            auVar114._0_4_ = uVar24;
            auVar114._8_4_ = uVar24;
            auVar114._12_4_ = uVar24;
            _local_258 = ~auVar138 & _local_258 | auVar114 & auVar138;
            auVar115._4_4_ = uVar14;
            auVar115._0_4_ = uVar14;
            auVar115._8_4_ = uVar14;
            auVar115._12_4_ = uVar14;
            _local_228 = ~auVar138 & _local_228 | auVar115 & auVar138;
            auVar116._4_4_ = uVar15;
            auVar116._0_4_ = uVar15;
            auVar116._8_4_ = uVar15;
            auVar116._12_4_ = uVar15;
            _local_238 = ~auVar138 & _local_238 | auVar116 & auVar138;
            auVar92._4_4_ = uVar16;
            auVar92._0_4_ = uVar16;
            auVar92._8_4_ = uVar16;
            auVar92._12_4_ = uVar16;
            in_XMM14 = ~auVar138 & in_XMM14 | auVar92 & auVar138;
            pAVar10 = pAVar12 + (long)iVar7 + 1;
            uVar24 = *(undefined4 *)&(pAVar10->l).vx.field_0;
            uVar14 = *(undefined4 *)((long)&(pAVar10->l).vx.field_0 + 4);
            uVar15 = *(undefined4 *)((long)&(pAVar10->l).vx.field_0 + 8);
            uVar16 = *(undefined4 *)((long)&(pAVar10->l).vx.field_0 + 0xc);
            auVar117._4_4_ = uVar24;
            auVar117._0_4_ = uVar24;
            auVar117._8_4_ = uVar24;
            auVar117._12_4_ = uVar24;
            _local_148 = ~auVar138 & _local_148 | auVar117 & auVar138;
            auVar118._4_4_ = uVar14;
            auVar118._0_4_ = uVar14;
            auVar118._8_4_ = uVar14;
            auVar118._12_4_ = uVar14;
            _local_1a8 = ~auVar138 & _local_1a8 | auVar118 & auVar138;
            auVar119._4_4_ = uVar15;
            auVar119._0_4_ = uVar15;
            auVar119._8_4_ = uVar15;
            auVar119._12_4_ = uVar15;
            _local_198 = ~auVar138 & _local_198 | auVar119 & auVar138;
            auVar93._4_4_ = uVar16;
            auVar93._0_4_ = uVar16;
            auVar93._8_4_ = uVar16;
            auVar93._12_4_ = uVar16;
            in_XMM9 = ~auVar138 & in_XMM9 | auVar93 & auVar138;
            pVVar2 = &pAVar12[(long)iVar7 + 1].l.vy;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar120._4_4_ = uVar24;
            auVar120._0_4_ = uVar24;
            auVar120._8_4_ = uVar24;
            auVar120._12_4_ = uVar24;
            _local_188 = ~auVar138 & _local_188 | auVar120 & auVar138;
            auVar121._4_4_ = uVar14;
            auVar121._0_4_ = uVar14;
            auVar121._8_4_ = uVar14;
            auVar121._12_4_ = uVar14;
            _local_178 = ~auVar138 & _local_178 | auVar121 & auVar138;
            auVar122._4_4_ = uVar15;
            auVar122._0_4_ = uVar15;
            auVar122._8_4_ = uVar15;
            auVar122._12_4_ = uVar15;
            _local_168 = ~auVar138 & _local_168 | auVar122 & auVar138;
            auVar94._4_4_ = uVar16;
            auVar94._0_4_ = uVar16;
            auVar94._8_4_ = uVar16;
            auVar94._12_4_ = uVar16;
            in_XMM8 = ~auVar138 & in_XMM8 | auVar94 & auVar138;
            pVVar2 = &pAVar12[(long)iVar7 + 1].l.vz;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar123._4_4_ = uVar24;
            auVar123._0_4_ = uVar24;
            auVar123._8_4_ = uVar24;
            auVar123._12_4_ = uVar24;
            _local_158 = ~auVar138 & _local_158 | auVar123 & auVar138;
            auVar124._4_4_ = uVar14;
            auVar124._0_4_ = uVar14;
            auVar124._8_4_ = uVar14;
            auVar124._12_4_ = uVar14;
            _local_1c8 = ~auVar138 & _local_1c8 | auVar124 & auVar138;
            auVar125._4_4_ = uVar15;
            auVar125._0_4_ = uVar15;
            auVar125._8_4_ = uVar15;
            auVar125._12_4_ = uVar15;
            _local_1b8 = ~auVar138 & _local_1b8 | auVar125 & auVar138;
            auVar95._4_4_ = uVar16;
            auVar95._0_4_ = uVar16;
            auVar95._8_4_ = uVar16;
            auVar95._12_4_ = uVar16;
            auVar66 = ~auVar138 & auVar66 | auVar95 & auVar138;
            pVVar2 = &pAVar12[(long)iVar7 + 1].p;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
            auVar126._4_4_ = uVar24;
            auVar126._0_4_ = uVar24;
            auVar126._8_4_ = uVar24;
            auVar126._12_4_ = uVar24;
            _local_218 = ~auVar138 & _local_218 | auVar126 & auVar138;
            auVar127._4_4_ = uVar14;
            auVar127._0_4_ = uVar14;
            auVar127._8_4_ = uVar14;
            auVar127._12_4_ = uVar14;
            _local_208 = ~auVar138 & _local_208 | auVar127 & auVar138;
            auVar128._4_4_ = uVar15;
            auVar128._0_4_ = uVar15;
            auVar128._8_4_ = uVar15;
            auVar128._12_4_ = uVar15;
            _local_278 = ~auVar138 & _local_278 | auVar128 & auVar138;
            auVar47 = auVar47 ^ auVar138;
            auVar202._4_4_ = uVar16;
            auVar202._0_4_ = uVar16;
            auVar202._8_4_ = uVar16;
            auVar202._12_4_ = uVar16;
            in_XMM10 = ~auVar138 & in_XMM10 | auVar202 & auVar138;
            uVar27 = movmskps(uVar27,auVar47);
          } while (uVar27 != 0);
        }
        auVar52._0_4_ =
             auVar66._0_4_ * in_XMM11._0_4_ +
             in_XMM8._0_4_ * in_XMM12._0_4_ +
             in_XMM9._0_4_ * in_XMM13._0_4_ + in_XMM10._0_4_ * in_XMM14._0_4_;
        auVar52._4_4_ =
             auVar66._4_4_ * in_XMM11._4_4_ +
             in_XMM8._4_4_ * in_XMM12._4_4_ +
             in_XMM9._4_4_ * in_XMM13._4_4_ + in_XMM10._4_4_ * in_XMM14._4_4_;
        auVar52._8_4_ =
             auVar66._8_4_ * in_XMM11._8_4_ +
             in_XMM8._8_4_ * in_XMM12._8_4_ +
             in_XMM9._8_4_ * in_XMM13._8_4_ + in_XMM10._8_4_ * in_XMM14._8_4_;
        auVar52._12_4_ =
             auVar66._12_4_ * in_XMM11._12_4_ +
             in_XMM8._12_4_ * in_XMM12._12_4_ +
             in_XMM9._12_4_ * in_XMM13._12_4_ + in_XMM10._12_4_ * in_XMM14._12_4_;
        fVar215 = (float)((uint)auVar52._0_4_ ^ (uint)DAT_01fec6d0);
        fVar31 = (float)((uint)auVar52._4_4_ ^ DAT_01fec6d0._4_4_);
        auVar182._4_4_ = fVar31;
        auVar182._0_4_ = fVar215;
        fVar176 = (float)((uint)auVar52._8_4_ ^ DAT_01fec6d0._8_4_);
        fVar178 = (float)((uint)auVar52._12_4_ ^ DAT_01fec6d0._12_4_);
        uVar27 = -(uint)(fVar215 <= auVar52._0_4_);
        uVar28 = -(uint)(fVar31 <= auVar52._4_4_);
        uVar29 = -(uint)(fVar176 <= auVar52._8_4_);
        uVar30 = -(uint)(fVar178 <= auVar52._12_4_);
        auVar129._4_4_ = uVar28;
        auVar129._0_4_ = uVar27;
        auVar129._8_4_ = uVar29;
        auVar129._12_4_ = uVar30;
        auVar182._8_4_ = fVar176;
        auVar182._12_4_ = fVar178;
        auVar47 = in_XMM10 ^ _DAT_01fec6d0;
        auVar96._0_4_ = ~uVar27 & auVar47._0_4_;
        auVar96._4_4_ = ~uVar28 & auVar47._4_4_;
        auVar96._8_4_ = ~uVar29 & auVar47._8_4_;
        auVar96._12_4_ = ~uVar30 & auVar47._12_4_;
        _local_98 = in_XMM10 & auVar129 | auVar96;
        auVar47 = in_XMM9 & auVar129 | ~auVar129 & (in_XMM9 ^ _DAT_01fec6d0);
        _local_88 = in_XMM8 & auVar129 | ~auVar129 & (in_XMM8 ^ _DAT_01fec6d0);
        auVar35 = maxps(auVar182,auVar52);
        fVar31 = ABS(auVar52._0_4_);
        fVar178 = ABS(auVar52._4_4_);
        fVar77 = ABS(auVar52._8_4_);
        fVar80 = ABS(auVar52._12_4_);
        _local_a8 = ~auVar129 & (auVar66 ^ _DAT_01fec6d0) | auVar66 & auVar129;
        fVar233 = auVar35._12_4_;
        fVar215 = auVar35._0_4_;
        fVar176 = auVar35._4_4_;
        fVar73 = auVar35._8_4_;
        auVar71._0_4_ = 1.0 - fVar31;
        auVar71._4_4_ = 1.0 - fVar178;
        auVar71._8_4_ = 1.0 - fVar77;
        auVar71._12_4_ = 1.0 - fVar80;
        auVar66 = sqrtps(auVar71,auVar71);
        fVar83 = 1.5707964 -
                 auVar66._0_4_ *
                 (((((fVar31 * -0.0043095737 + 0.0192803) * fVar31 + -0.04489909) * fVar31 +
                   0.08785567) * fVar31 + -0.21450998) * fVar31 + 1.5707952);
        fVar154 = 1.5707964 -
                  auVar66._4_4_ *
                  (((((fVar178 * -0.0043095737 + 0.0192803) * fVar178 + -0.04489909) * fVar178 +
                    0.08785567) * fVar178 + -0.21450998) * fVar178 + 1.5707952);
        fVar32 = 1.5707964 -
                 auVar66._8_4_ *
                 (((((fVar77 * -0.0043095737 + 0.0192803) * fVar77 + -0.04489909) * fVar77 +
                   0.08785567) * fVar77 + -0.21450998) * fVar77 + 1.5707952);
        fVar36 = 1.5707964 -
                 auVar66._12_4_ *
                 (((((fVar80 * -0.0043095737 + 0.0192803) * fVar80 + -0.04489909) * fVar80 +
                   0.08785567) * fVar80 + -0.21450998) * fVar80 + 1.5707952);
        uVar27 = -(uint)(0.0 <= fVar83) & (uint)fVar83;
        uVar28 = -(uint)(0.0 <= fVar154) & (uint)fVar154;
        uVar29 = -(uint)(0.0 <= fVar32) & (uint)fVar32;
        uVar30 = -(uint)(0.0 <= fVar36) & (uint)fVar36;
        local_b8 = (float)(~-(uint)(fVar31 <= 1.0) & 0x7fc00000 |
                          (uint)(1.5707964 -
                                (float)(~-(uint)(0.0 <= fVar215) & (uVar27 ^ (uint)DAT_01fec6d0) |
                                       uVar27 & -(uint)(0.0 <= fVar215))) & -(uint)(fVar31 <= 1.0))
                   * fVar135;
        fStack_b4 = (float)(~-(uint)(fVar178 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar176) & (uVar28 ^ DAT_01fec6d0._4_4_) |
                                        uVar28 & -(uint)(0.0 <= fVar176))) & -(uint)(fVar178 <= 1.0)
                           ) * fVar238;
        fStack_b0 = (float)(~-(uint)(fVar77 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar73) & (uVar29 ^ DAT_01fec6d0._8_4_) |
                                        uVar29 & -(uint)(0.0 <= fVar73))) & -(uint)(fVar77 <= 1.0))
                    * fVar168;
        fStack_ac = (float)(~-(uint)(fVar80 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar233) & (uVar30 ^ DAT_01fec6d0._12_4_) |
                                        uVar30 & -(uint)(0.0 <= fVar233))) & -(uint)(fVar80 <= 1.0))
                    * fVar174;
        fVar31 = local_b8 * 0.63661975;
        fVar178 = fStack_b4 * 0.63661975;
        fVar77 = fStack_ac * 0.63661975;
        _local_78 = in_XMM14;
        _local_68 = in_XMM13;
        _local_58 = in_XMM12;
        _local_48 = in_XMM11;
        local_c8 = floorf(fStack_b0 * 0.63661975);
        fStack_c4 = extraout_XMM0_Db_06;
        fStack_c0 = extraout_XMM0_Dc_06;
        fStack_bc = extraout_XMM0_Dd_06;
        local_d8 = floorf(fVar77);
        local_e8 = floorf(fVar31);
        fVar31 = floorf(fVar178);
        uVar27 = (uint)local_e8;
        uVar29 = (uint)fVar31;
        uVar38 = (uint)local_c8;
        uVar41 = (uint)local_d8;
        fVar178 = local_b8 - local_e8 * 1.5707964;
        fVar31 = fStack_b4 - fVar31 * 1.5707964;
        auVar149._4_4_ = fVar31;
        auVar149._0_4_ = fVar178;
        fVar77 = fStack_b0 - local_c8 * 1.5707964;
        fVar80 = fStack_ac - local_d8 * 1.5707964;
        auVar149._8_4_ = fVar77;
        auVar149._12_4_ = fVar80;
        fVar83 = fVar178 * fVar178;
        fVar154 = fVar31 * fVar31;
        fVar32 = fVar77 * fVar77;
        fVar36 = fVar80 * fVar80;
        uVar99 = -(uint)(1 < (uVar27 & 3));
        uVar132 = -(uint)(1 < (uVar29 & 3));
        uVar134 = -(uint)(1 < (uVar38 & 3));
        uVar136 = -(uint)(1 < (uVar41 & 3));
        fVar178 = (((((fVar83 * -2.5029328e-08 + 2.7600126e-06) * fVar83 + -0.00019842605) * fVar83
                    + 0.008333348) * fVar83 + -0.16666667) * fVar83 + 1.0) * fVar178;
        fVar31 = (((((fVar154 * -2.5029328e-08 + 2.7600126e-06) * fVar154 + -0.00019842605) *
                    fVar154 + 0.008333348) * fVar154 + -0.16666667) * fVar154 + 1.0) * fVar31;
        fVar77 = (((((fVar32 * -2.5029328e-08 + 2.7600126e-06) * fVar32 + -0.00019842605) * fVar32 +
                   0.008333348) * fVar32 + -0.16666667) * fVar32 + 1.0) * fVar77;
        fVar80 = (((((fVar36 * -2.5029328e-08 + 2.7600126e-06) * fVar36 + -0.00019842605) * fVar36 +
                   0.008333348) * fVar36 + -0.16666667) * fVar36 + 1.0) * fVar80;
        uVar28 = -(uint)((uVar27 & 1) == 0);
        uVar30 = -(uint)((uVar29 & 1) == 0);
        uVar39 = -(uint)((uVar38 & 1) == 0);
        uVar42 = -(uint)((uVar41 & 1) == 0);
        fVar83 = ((((fVar83 * -2.5963018e-07 + 2.4756235e-05) * fVar83 + -0.001388833) * fVar83 +
                  0.04166664) * fVar83 + -0.5) * fVar83 + 1.0;
        fVar154 = ((((fVar154 * -2.5963018e-07 + 2.4756235e-05) * fVar154 + -0.001388833) * fVar154
                   + 0.04166664) * fVar154 + -0.5) * fVar154 + 1.0;
        fVar32 = ((((fVar32 * -2.5963018e-07 + 2.4756235e-05) * fVar32 + -0.001388833) * fVar32 +
                  0.04166664) * fVar32 + -0.5) * fVar32 + 1.0;
        fVar36 = ((((fVar36 * -2.5963018e-07 + 2.4756235e-05) * fVar36 + -0.001388833) * fVar36 +
                  0.04166664) * fVar36 + -0.5) * fVar36 + 1.0;
        uVar28 = uVar28 & (uint)fVar178 | ~uVar28 & (uint)fVar83;
        uVar30 = uVar30 & (uint)fVar31 | ~uVar30 & (uint)fVar154;
        uVar39 = uVar39 & (uint)fVar77 | ~uVar39 & (uint)fVar32;
        uVar42 = uVar42 & (uint)fVar80 | ~uVar42 & (uint)fVar36;
        uVar74 = (int)(uVar27 << 0x1f) >> 0x1f;
        uVar78 = (int)(uVar29 << 0x1f) >> 0x1f;
        uVar81 = (int)(uVar38 << 0x1f) >> 0x1f;
        uVar84 = (int)(uVar41 << 0x1f) >> 0x1f;
        uVar74 = ~uVar74 & (uint)fVar83 | (uint)fVar178 & uVar74;
        uVar78 = ~uVar78 & (uint)fVar154 | (uint)fVar31 & uVar78;
        uVar81 = ~uVar81 & (uint)fVar32 | (uint)fVar77 & uVar81;
        uVar84 = ~uVar84 & (uint)fVar36 | (uint)fVar80 & uVar84;
        fVar31 = (float)((uVar28 ^ 0x80000000) & uVar99 | ~uVar99 & uVar28);
        fVar178 = (float)((uVar30 ^ 0x80000000) & uVar132 | ~uVar132 & uVar30);
        fVar77 = (float)((uVar39 ^ 0x80000000) & uVar134 | ~uVar134 & uVar39);
        fVar83 = (float)((uVar42 ^ 0x80000000) & uVar136 | ~uVar136 & uVar42);
        uVar27 = -(uint)(0x7ffffffd < (int)((uVar27 & 3) - 3 ^ 0x80000000));
        uVar28 = -(uint)(0x7ffffffd < (int)((uVar29 & 3) - 3 ^ 0x80000000));
        uVar29 = -(uint)(0x7ffffffd < (int)((uVar38 & 3) - 3 ^ 0x80000000));
        uVar30 = -(uint)(0x7ffffffd < (int)((uVar41 & 3) - 3 ^ 0x80000000));
        fVar55 = (float)((uVar74 ^ 0x80000000) & uVar27 | ~uVar27 & uVar74);
        fVar62 = (float)((uVar78 ^ 0x80000000) & uVar28 | ~uVar28 & uVar78);
        fVar63 = (float)((uVar81 ^ 0x80000000) & uVar29 | ~uVar29 & uVar81);
        fVar64 = (float)((uVar84 ^ 0x80000000) & uVar30 | ~uVar30 & uVar84);
        fVar80 = (float)local_78._0_4_ * fVar215 - (float)local_98._0_4_;
        fVar32 = (float)local_78._4_4_ * fVar176 - (float)local_98._4_4_;
        fVar36 = fStack_70 * fVar73 - fStack_90;
        fVar43 = fStack_6c * fVar233 - fStack_8c;
        local_118 = auVar47._0_4_;
        fStack_114 = auVar47._4_4_;
        fStack_110 = auVar47._8_4_;
        fStack_10c = auVar47._12_4_;
        fVar98 = (float)local_68._0_4_ * fVar215 - local_118;
        fVar131 = (float)local_68._4_4_ * fVar176 - fStack_114;
        fVar133 = fStack_60 * fVar73 - fStack_110;
        fVar146 = fStack_5c * fVar233 - fStack_10c;
        fVar150 = (float)local_58._0_4_ * fVar215 - (float)local_88._0_4_;
        fVar151 = (float)local_58._4_4_ * fVar176 - (float)local_88._4_4_;
        fVar152 = fStack_50 * fVar73 - fStack_80;
        fVar153 = fStack_4c * fVar233 - fStack_7c;
        fVar72 = (float)local_48._0_4_ * fVar215 - (float)local_a8._0_4_;
        fVar76 = (float)local_48._4_4_ * fVar176 - (float)local_a8._4_4_;
        fVar79 = fStack_40 * fVar73 - fStack_a0;
        fVar82 = fStack_3c * fVar233 - fStack_9c;
        auVar61._0_4_ = fVar72 * fVar72 + fVar150 * fVar150 + fVar98 * fVar98 + fVar80 * fVar80;
        auVar61._4_4_ = fVar76 * fVar76 + fVar151 * fVar151 + fVar131 * fVar131 + fVar32 * fVar32;
        auVar61._8_4_ = fVar79 * fVar79 + fVar152 * fVar152 + fVar133 * fVar133 + fVar36 * fVar36;
        auVar61._12_4_ = fVar82 * fVar82 + fVar153 * fVar153 + fVar146 * fVar146 + fVar43 * fVar43;
        auVar66 = rsqrtps(auVar149,auVar61);
        fVar154 = auVar66._0_4_;
        fVar37 = auVar66._4_4_;
        fVar40 = auVar66._8_4_;
        fVar53 = auVar66._12_4_;
        fVar157 = fVar154 * 1.5 - fVar154 * fVar154 * auVar61._0_4_ * 0.5 * fVar154;
        fVar160 = fVar37 * 1.5 - fVar37 * fVar37 * auVar61._4_4_ * 0.5 * fVar37;
        fVar162 = fVar40 * 1.5 - fVar40 * fVar40 * auVar61._8_4_ * 0.5 * fVar40;
        fVar180 = fVar53 * 1.5 - fVar53 * fVar53 * auVar61._12_4_ * 0.5 * fVar53;
        fVar194 = ((float)local_98._0_4_ - (float)local_78._0_4_) * fVar135 + (float)local_78._0_4_;
        fVar196 = ((float)local_98._4_4_ - (float)local_78._4_4_) * fVar238 + (float)local_78._4_4_;
        fVar198 = (fStack_90 - fStack_70) * fVar168 + fStack_70;
        fVar200 = (fStack_8c - fStack_6c) * fVar174 + fStack_6c;
        fVar183 = (local_118 - (float)local_68._0_4_) * fVar135 + (float)local_68._0_4_;
        fVar185 = (fStack_114 - (float)local_68._4_4_) * fVar238 + (float)local_68._4_4_;
        fVar187 = (fStack_110 - fStack_60) * fVar168 + fStack_60;
        fVar189 = (fStack_10c - fStack_5c) * fVar174 + fStack_5c;
        fVar235 = ((float)local_88._0_4_ - (float)local_58._0_4_) * fVar135 + (float)local_58._0_4_;
        fVar237 = ((float)local_88._4_4_ - (float)local_58._4_4_) * fVar238 + (float)local_58._4_4_;
        fVar142 = (fStack_80 - fStack_50) * fVar168 + fStack_50;
        fVar143 = (fStack_7c - fStack_4c) * fVar174 + fStack_4c;
        fVar211 = ((float)local_a8._0_4_ - (float)local_48._0_4_) * fVar135 + (float)local_48._0_4_;
        fVar212 = ((float)local_a8._4_4_ - (float)local_48._4_4_) * fVar238 + (float)local_48._4_4_;
        fVar213 = (fStack_a0 - fStack_40) * fVar168 + fStack_40;
        fVar214 = (fStack_9c - fStack_3c) * fVar174 + fStack_3c;
        auVar97._0_4_ = fVar235 * fVar235 + fVar183 * fVar183 + fVar194 * fVar194;
        auVar97._4_4_ = fVar237 * fVar237 + fVar185 * fVar185 + fVar196 * fVar196;
        auVar97._8_4_ = fVar142 * fVar142 + fVar187 * fVar187 + fVar198 * fVar198;
        auVar97._12_4_ = fVar143 * fVar143 + fVar189 * fVar189 + fVar200 * fVar200;
        auVar130._0_4_ = fVar211 * fVar211 + auVar97._0_4_;
        auVar130._4_4_ = fVar212 * fVar212 + auVar97._4_4_;
        auVar130._8_4_ = fVar213 * fVar213 + auVar97._8_4_;
        auVar130._12_4_ = fVar214 * fVar214 + auVar97._12_4_;
        auVar66 = rsqrtps(auVar97,auVar130);
        fVar154 = auVar66._0_4_;
        fVar40 = auVar66._4_4_;
        fVar53 = auVar66._8_4_;
        fVar54 = auVar66._12_4_;
        fVar37 = fVar154 * 1.5 - fVar154 * fVar154 * auVar130._0_4_ * 0.5 * fVar154;
        fVar40 = fVar40 * 1.5 - fVar40 * fVar40 * auVar130._4_4_ * 0.5 * fVar40;
        fVar53 = fVar53 * 1.5 - fVar53 * fVar53 * auVar130._8_4_ * 0.5 * fVar53;
        fVar54 = fVar54 * 1.5 - fVar54 * fVar54 * auVar130._12_4_ * 0.5 * fVar54;
        uVar27 = -(uint)(fVar215 <= 0.9995);
        uVar28 = -(uint)(fVar176 <= 0.9995);
        uVar29 = -(uint)(fVar73 <= 0.9995);
        uVar30 = -(uint)(fVar233 <= 0.9995);
        fVar154 = (float)(~uVar27 & (uint)(fVar194 * fVar37) |
                         (uint)((float)local_78._0_4_ * fVar55 - fVar80 * fVar157 * fVar31) & uVar27
                         );
        fVar32 = (float)(~uVar28 & (uint)(fVar196 * fVar40) |
                        (uint)((float)local_78._4_4_ * fVar62 - fVar32 * fVar160 * fVar178) & uVar28
                        );
        fVar36 = (float)(~uVar29 & (uint)(fVar198 * fVar53) |
                        (uint)(fStack_70 * fVar63 - fVar36 * fVar162 * fVar77) & uVar29);
        fVar43 = (float)(~uVar30 & (uint)(fVar200 * fVar54) |
                        (uint)(fStack_6c * fVar64 - fVar43 * fVar180 * fVar83) & uVar30);
        fVar215 = (float)(~uVar27 & (uint)(fVar183 * fVar37) |
                         (uint)((float)local_68._0_4_ * fVar55 - fVar98 * fVar157 * fVar31) & uVar27
                         );
        fVar176 = (float)(~uVar28 & (uint)(fVar185 * fVar40) |
                         (uint)((float)local_68._4_4_ * fVar62 - fVar131 * fVar160 * fVar178) &
                         uVar28);
        fVar73 = (float)(~uVar29 & (uint)(fVar187 * fVar53) |
                        (uint)(fStack_60 * fVar63 - fVar133 * fVar162 * fVar77) & uVar29);
        fVar80 = (float)(~uVar30 & (uint)(fVar189 * fVar54) |
                        (uint)(fStack_5c * fVar64 - fVar146 * fVar180 * fVar83) & uVar30);
        fVar98 = (float)(~uVar27 & (uint)(fVar235 * fVar37) |
                        (uint)((float)local_58._0_4_ * fVar55 - fVar150 * fVar157 * fVar31) & uVar27
                        );
        fVar131 = (float)(~uVar28 & (uint)(fVar237 * fVar40) |
                         (uint)((float)local_58._4_4_ * fVar62 - fVar151 * fVar160 * fVar178) &
                         uVar28);
        fVar133 = (float)(~uVar29 & (uint)(fVar142 * fVar53) |
                         (uint)(fStack_50 * fVar63 - fVar152 * fVar162 * fVar77) & uVar29);
        fVar146 = (float)(~uVar30 & (uint)(fVar143 * fVar54) |
                         (uint)(fStack_4c * fVar64 - fVar153 * fVar180 * fVar83) & uVar30);
        fVar31 = (float)(~uVar27 & (uint)(fVar37 * fVar211) |
                        (uint)(fVar55 * (float)local_48._0_4_ - fVar157 * fVar72 * fVar31) & uVar27)
        ;
        fVar178 = (float)(~uVar28 & (uint)(fVar40 * fVar212) |
                         (uint)(fVar62 * (float)local_48._4_4_ - fVar160 * fVar76 * fVar178) &
                         uVar28);
        fVar77 = (float)(~uVar29 & (uint)(fVar53 * fVar213) |
                        (uint)(fVar63 * fStack_40 - fVar162 * fVar79 * fVar77) & uVar29);
        fVar83 = (float)(~uVar30 & (uint)(fVar54 * fVar214) |
                        (uint)(fVar64 * fStack_3c - fVar180 * fVar82 * fVar83) & uVar30);
        fVar37 = 1.0 - fVar135;
        fVar40 = 1.0 - fVar238;
        fVar53 = 1.0 - fVar168;
        fVar54 = 1.0 - fVar174;
        fVar55 = (float)local_248._0_4_ * fVar37 + (float)local_148._0_4_ * fVar135;
        fVar62 = (float)local_248._4_4_ * fVar40 + (float)local_148._4_4_ * fVar238;
        fVar63 = fStack_240 * fVar53 + fStack_140 * fVar168;
        fVar64 = fStack_23c * fVar54 + fStack_13c * fVar174;
        local_2b8._4_4_ = (float)local_2b8._4_4_ * fVar40 + (float)local_1a8._4_4_ * fVar238;
        local_2b8._0_4_ = (float)local_2b8._0_4_ * fVar37 + (float)local_1a8._0_4_ * fVar135;
        uStack_2b0._0_4_ = (float)uStack_2b0 * fVar53 + fStack_1a0 * fVar168;
        uStack_2b0._4_4_ = uStack_2b0._4_4_ * fVar54 + fStack_19c * fVar174;
        local_2c8._4_4_ = (float)local_2c8._4_4_ * fVar40 + (float)local_198._4_4_ * fVar238;
        local_2c8._0_4_ = (float)local_2c8._0_4_ * fVar37 + (float)local_198._0_4_ * fVar135;
        uStack_2c0._0_4_ = (float)uStack_2c0 * fVar53 + fStack_190 * fVar168;
        uStack_2c0._4_4_ = uStack_2c0._4_4_ * fVar54 + fStack_18c * fVar174;
        local_268._4_4_ = (float)local_268._4_4_ * fVar40 + (float)local_188._4_4_ * fVar238;
        local_268._0_4_ = (float)local_268._0_4_ * fVar37 + (float)local_188._0_4_ * fVar135;
        fStack_260 = fStack_260 * fVar53 + fStack_180 * fVar168;
        fStack_25c = fStack_25c * fVar54 + fStack_17c * fVar174;
        local_2a8._4_4_ = (float)local_2a8._4_4_ * fVar40 + (float)local_178._4_4_ * fVar238;
        local_2a8._0_4_ = (float)local_2a8._0_4_ * fVar37 + (float)local_178._0_4_ * fVar135;
        uStack_2a0._0_4_ = (float)uStack_2a0 * fVar53 + fStack_170 * fVar168;
        uStack_2a0._4_4_ = uStack_2a0._4_4_ * fVar54 + fStack_16c * fVar174;
        local_298._4_4_ = (float)local_298._4_4_ * fVar40 + (float)local_168._4_4_ * fVar238;
        local_298._0_4_ = (float)local_298._0_4_ * fVar37 + (float)local_168._0_4_ * fVar135;
        uStack_290._0_4_ = (float)uStack_290 * fVar53 + fStack_160 * fVar168;
        uStack_290._4_4_ = uStack_290._4_4_ * fVar54 + fStack_15c * fVar174;
        local_288._4_4_ = (float)local_288._4_4_ * fVar40 + (float)local_158._4_4_ * fVar238;
        local_288._0_4_ = (float)local_288._0_4_ * fVar37 + (float)local_158._0_4_ * fVar135;
        uStack_280._0_4_ = (float)uStack_280 * fVar53 + fStack_150 * fVar168;
        uStack_280._4_4_ = uStack_280._4_4_ * fVar54 + fStack_14c * fVar174;
        local_1e8._4_4_ = (float)local_1e8._4_4_ * fVar40 + (float)local_1c8._4_4_ * fVar238;
        local_1e8._0_4_ = (float)local_1e8._0_4_ * fVar37 + (float)local_1c8._0_4_ * fVar135;
        fStack_1e0 = fStack_1e0 * fVar53 + fStack_1c0 * fVar168;
        fStack_1dc = fStack_1dc * fVar54 + fStack_1bc * fVar174;
        local_1f8._4_4_ = (float)local_1f8._4_4_ * fVar40 + (float)local_1b8._4_4_ * fVar238;
        local_1f8._0_4_ = (float)local_1f8._0_4_ * fVar37 + (float)local_1b8._0_4_ * fVar135;
        fStack_1f0 = fStack_1f0 * fVar53 + fStack_1b0 * fVar168;
        fStack_1ec = fStack_1ec * fVar54 + fStack_1ac * fVar174;
        local_258._4_4_ = (float)local_258._4_4_ * fVar40 + (float)local_218._4_4_ * fVar238;
        local_258._0_4_ = (float)local_258._0_4_ * fVar37 + (float)local_218._0_4_ * fVar135;
        fStack_250 = fStack_250 * fVar53 + fStack_210 * fVar168;
        fStack_24c = fStack_24c * fVar54 + fStack_20c * fVar174;
        local_228._4_4_ = (float)local_228._4_4_ * fVar40 + (float)local_208._4_4_ * fVar238;
        local_228._0_4_ = (float)local_228._0_4_ * fVar37 + (float)local_208._0_4_ * fVar135;
        fStack_220 = fStack_220 * fVar53 + fStack_200 * fVar168;
        fStack_21c = fStack_21c * fVar54 + fStack_1fc * fVar174;
        fVar135 = fVar37 * (float)local_238._0_4_ + (float)local_278._0_4_ * fVar135;
        fVar238 = fVar40 * (float)local_238._4_4_ + (float)local_278._4_4_ * fVar238;
        fVar168 = fVar53 * fStack_230 + fStack_270 * fVar168;
        fVar174 = fVar54 * fStack_22c + fStack_26c * fVar174;
      }
      fVar72 = fVar215 * fVar98 + fVar154 * fVar31;
      fVar76 = fVar176 * fVar131 + fVar32 * fVar178;
      fVar79 = fVar73 * fVar133 + fVar36 * fVar77;
      fVar82 = fVar80 * fVar146 + fVar43 * fVar83;
      fVar185 = fVar215 * fVar98 - fVar154 * fVar31;
      fVar189 = fVar176 * fVar131 - fVar32 * fVar178;
      fVar196 = fVar73 * fVar133 - fVar36 * fVar77;
      fVar200 = fVar80 * fVar146 - fVar43 * fVar83;
      fVar233 = fVar98 * fVar98;
      fVar235 = fVar131 * fVar131;
      fVar237 = fVar133 * fVar133;
      fVar142 = fVar146 * fVar146;
      fVar37 = fVar154 * fVar154 - fVar215 * fVar215;
      fVar40 = fVar32 * fVar32 - fVar176 * fVar176;
      fVar53 = fVar36 * fVar36 - fVar73 * fVar73;
      fVar54 = fVar43 * fVar43 - fVar80 * fVar80;
      fVar211 = fVar215 * fVar31 - fVar154 * fVar98;
      fVar212 = fVar176 * fVar178 - fVar32 * fVar131;
      fVar213 = fVar73 * fVar77 - fVar36 * fVar133;
      fVar214 = fVar80 * fVar83 - fVar43 * fVar146;
      fVar150 = fVar154 * fVar98 + fVar215 * fVar31;
      fVar151 = fVar32 * fVar131 + fVar176 * fVar178;
      fVar152 = fVar36 * fVar133 + fVar73 * fVar77;
      fVar153 = fVar43 * fVar146 + fVar80 * fVar83;
      fVar143 = fVar31 * fVar98 + fVar215 * fVar154;
      fVar159 = fVar178 * fVar131 + fVar176 * fVar32;
      fVar144 = fVar77 * fVar133 + fVar73 * fVar36;
      fVar145 = fVar83 * fVar146 + fVar80 * fVar43;
      fVar98 = fVar31 * fVar98 - fVar215 * fVar154;
      fVar131 = fVar178 * fVar131 - fVar176 * fVar32;
      fVar133 = fVar77 * fVar133 - fVar73 * fVar36;
      fVar146 = fVar83 * fVar146 - fVar80 * fVar43;
      fVar31 = fVar31 * fVar31;
      fVar178 = fVar178 * fVar178;
      fVar77 = fVar77 * fVar77;
      fVar83 = fVar83 * fVar83;
      fVar157 = ((fVar154 * fVar154 + fVar215 * fVar215) - fVar233) - fVar31;
      fVar160 = ((fVar32 * fVar32 + fVar176 * fVar176) - fVar235) - fVar178;
      fVar162 = ((fVar36 * fVar36 + fVar73 * fVar73) - fVar237) - fVar77;
      fVar180 = ((fVar43 * fVar43 + fVar80 * fVar80) - fVar142) - fVar83;
      fVar183 = (fVar233 + fVar37) - fVar31;
      fVar187 = (fVar235 + fVar40) - fVar178;
      fVar194 = (fVar237 + fVar53) - fVar77;
      fVar198 = (fVar142 + fVar54) - fVar83;
      fVar31 = (fVar37 - fVar233) + fVar31;
      fVar178 = (fVar40 - fVar235) + fVar178;
      fVar77 = (fVar53 - fVar237) + fVar77;
      fVar83 = (fVar54 - fVar142) + fVar83;
      fVar72 = fVar72 + fVar72;
      fVar76 = fVar76 + fVar76;
      fVar79 = fVar79 + fVar79;
      fVar82 = fVar82 + fVar82;
      fVar211 = fVar211 + fVar211;
      fVar212 = fVar212 + fVar212;
      fVar213 = fVar213 + fVar213;
      fVar214 = fVar214 + fVar214;
      fVar37 = fVar211 * 0.0;
      fVar40 = fVar212 * 0.0;
      fVar53 = fVar213 * 0.0;
      fVar54 = fVar214 * 0.0;
      fVar215 = fVar72 * 0.0;
      fVar73 = fVar76 * 0.0;
      fVar154 = fVar79 * 0.0;
      fVar36 = fVar82 * 0.0;
      fVar176 = fVar215 + fVar37 + fVar157;
      fVar80 = fVar73 + fVar40 + fVar160;
      fVar32 = fVar154 + fVar53 + fVar162;
      fVar43 = fVar36 + fVar54 + fVar180;
      fVar157 = fVar157 * 0.0;
      fVar160 = fVar160 * 0.0;
      fVar162 = fVar162 * 0.0;
      fVar180 = fVar180 * 0.0;
      fVar233 = fVar37 + fVar72 + fVar157;
      fVar235 = fVar40 + fVar76 + fVar160;
      fVar237 = fVar53 + fVar79 + fVar162;
      fVar142 = fVar54 + fVar82 + fVar180;
      fVar157 = fVar157 + fVar211 + fVar215;
      fVar160 = fVar160 + fVar212 + fVar73;
      fVar162 = fVar162 + fVar213 + fVar154;
      fVar180 = fVar180 + fVar214 + fVar36;
      fVar143 = fVar143 + fVar143;
      fVar159 = fVar159 + fVar159;
      fVar144 = fVar144 + fVar144;
      fVar145 = fVar145 + fVar145;
      fVar37 = fVar143 * 0.0;
      fVar40 = fVar159 * 0.0;
      fVar53 = fVar144 * 0.0;
      fVar54 = fVar145 * 0.0;
      fVar215 = fVar183 * 0.0;
      fVar73 = fVar187 * 0.0;
      fVar154 = fVar194 * 0.0;
      fVar36 = fVar198 * 0.0;
      fVar185 = fVar185 + fVar185;
      fVar189 = fVar189 + fVar189;
      fVar196 = fVar196 + fVar196;
      fVar200 = fVar200 + fVar200;
      fVar72 = fVar37 + fVar215 + fVar185;
      fVar76 = fVar40 + fVar73 + fVar189;
      fVar79 = fVar53 + fVar154 + fVar196;
      fVar82 = fVar54 + fVar36 + fVar200;
      fVar185 = fVar185 * 0.0;
      fVar189 = fVar189 * 0.0;
      fVar196 = fVar196 * 0.0;
      fVar200 = fVar200 * 0.0;
      fVar183 = fVar183 + fVar37 + fVar185;
      fVar187 = fVar187 + fVar40 + fVar189;
      fVar211 = fVar194 + fVar53 + fVar196;
      fVar212 = fVar198 + fVar54 + fVar200;
      fVar185 = fVar185 + fVar215 + fVar143;
      fVar189 = fVar189 + fVar73 + fVar159;
      fVar196 = fVar196 + fVar154 + fVar144;
      fVar200 = fVar200 + fVar36 + fVar145;
      fVar98 = fVar98 + fVar98;
      fVar131 = fVar131 + fVar131;
      fVar133 = fVar133 + fVar133;
      fVar146 = fVar146 + fVar146;
      fVar37 = fVar31 * 0.0;
      fVar40 = fVar178 * 0.0;
      fVar53 = fVar77 * 0.0;
      fVar54 = fVar83 * 0.0;
      fVar215 = fVar98 * 0.0;
      fVar73 = fVar131 * 0.0;
      fVar154 = fVar133 * 0.0;
      fVar36 = fVar146 * 0.0;
      fVar150 = fVar150 + fVar150;
      fVar151 = fVar151 + fVar151;
      fVar152 = fVar152 + fVar152;
      fVar153 = fVar153 + fVar153;
      fVar145 = fVar215 + fVar37 + fVar150;
      fVar155 = fVar73 + fVar40 + fVar151;
      fVar158 = fVar154 + fVar53 + fVar152;
      fVar161 = fVar36 + fVar54 + fVar153;
      fVar150 = fVar150 * 0.0;
      fVar151 = fVar151 * 0.0;
      fVar152 = fVar152 * 0.0;
      fVar153 = fVar153 * 0.0;
      fVar214 = fVar37 + fVar98 + fVar150;
      fVar143 = fVar40 + fVar131 + fVar151;
      fVar159 = fVar53 + fVar133 + fVar152;
      fVar144 = fVar54 + fVar146 + fVar153;
      fVar150 = fVar150 + fVar215 + fVar31;
      fVar151 = fVar151 + fVar73 + fVar178;
      fVar152 = fVar152 + fVar154 + fVar77;
      fVar153 = fVar153 + fVar36 + fVar83;
      fVar146 = fVar55 * fVar176 + fVar72 * 0.0 + fVar145 * 0.0;
      fVar194 = fVar62 * fVar80 + fVar76 * 0.0 + fVar155 * 0.0;
      fVar198 = fVar63 * fVar32 + fVar79 * 0.0 + fVar158 * 0.0;
      fVar213 = fVar64 * fVar43 + fVar82 * 0.0 + fVar161 * 0.0;
      fVar163 = fVar55 * fVar233 + fVar183 * 0.0 + fVar214 * 0.0;
      fVar184 = fVar62 * fVar235 + fVar187 * 0.0 + fVar143 * 0.0;
      fVar186 = fVar63 * fVar237 + fVar211 * 0.0 + fVar159 * 0.0;
      fVar188 = fVar64 * fVar142 + fVar212 * 0.0 + fVar144 * 0.0;
      fVar199 = fVar55 * fVar157 + fVar185 * 0.0 + fVar150 * 0.0;
      fVar234 = fVar62 * fVar160 + fVar189 * 0.0 + fVar151 * 0.0;
      fVar236 = fVar63 * fVar162 + fVar196 * 0.0 + fVar152 * 0.0;
      fVar239 = fVar64 * fVar180 + fVar200 * 0.0 + fVar153 * 0.0;
      fVar73 = (float)local_268._0_4_ * fVar176 + (float)local_2a8._0_4_ * fVar72 + fVar145 * 0.0;
      fVar77 = (float)local_268._4_4_ * fVar80 + (float)local_2a8._4_4_ * fVar76 + fVar155 * 0.0;
      fVar83 = fStack_260 * fVar32 + (float)uStack_2a0 * fVar79 + fVar158 * 0.0;
      fVar154 = fStack_25c * fVar43 + uStack_2a0._4_4_ * fVar82 + fVar161 * 0.0;
      fVar36 = (float)local_268._0_4_ * fVar233 + (float)local_2a8._0_4_ * fVar183 + fVar214 * 0.0;
      fVar40 = (float)local_268._4_4_ * fVar235 + (float)local_2a8._4_4_ * fVar187 + fVar143 * 0.0;
      fVar54 = fStack_260 * fVar237 + (float)uStack_2a0 * fVar211 + fVar159 * 0.0;
      fVar62 = fStack_25c * fVar142 + uStack_2a0._4_4_ * fVar212 + fVar144 * 0.0;
      fVar191 = (float)local_268._0_4_ * fVar157 + (float)local_2a8._0_4_ * fVar185 + fVar150 * 0.0;
      fVar169 = (float)local_268._4_4_ * fVar160 + (float)local_2a8._4_4_ * fVar189 + fVar151 * 0.0;
      fVar175 = fStack_260 * fVar162 + (float)uStack_2a0 * fVar196 + fVar152 * 0.0;
      fVar177 = fStack_25c * fVar180 + uStack_2a0._4_4_ * fVar200 + fVar153 * 0.0;
      fVar37 = (float)local_288._0_4_ * fVar176 +
               (float)local_1e8._0_4_ * fVar72 + (float)local_1f8._0_4_ * fVar145;
      fVar53 = (float)local_288._4_4_ * fVar80 +
               (float)local_1e8._4_4_ * fVar76 + (float)local_1f8._4_4_ * fVar155;
      fVar55 = (float)uStack_280 * fVar32 + fStack_1e0 * fVar79 + fStack_1f0 * fVar158;
      fVar63 = uStack_280._4_4_ * fVar43 + fStack_1dc * fVar82 + fStack_1ec * fVar161;
      fVar179 = (float)local_288._0_4_ * fVar233 +
                (float)local_1e8._0_4_ * fVar183 + (float)local_1f8._0_4_ * fVar214;
      fVar190 = (float)local_288._4_4_ * fVar235 +
                (float)local_1e8._4_4_ * fVar187 + (float)local_1f8._4_4_ * fVar143;
      fVar195 = (float)uStack_280 * fVar237 + fStack_1e0 * fVar211 + fStack_1f0 * fVar159;
      fVar197 = uStack_280._4_4_ * fVar142 + fStack_1dc * fVar212 + fStack_1ec * fVar144;
      fVar64 = (float)local_288._0_4_ * fVar157 +
               (float)local_1e8._0_4_ * fVar185 + (float)local_1f8._0_4_ * fVar150;
      fVar98 = (float)local_288._4_4_ * fVar160 +
               (float)local_1e8._4_4_ * fVar189 + (float)local_1f8._4_4_ * fVar151;
      fVar131 = (float)uStack_280 * fVar162 + fStack_1e0 * fVar196 + fStack_1f0 * fVar152;
      fVar133 = uStack_280._4_4_ * fVar180 + fStack_1dc * fVar200 + fStack_1ec * fVar153;
      fVar215 = fVar176 * (float)local_258._0_4_ +
                fVar72 * (float)local_228._0_4_ + fVar145 * fVar135 + (float)local_2b8._0_4_ + 0.0;
      fVar31 = fVar80 * (float)local_258._4_4_ + fVar76 * (float)local_228._4_4_ + fVar155 * fVar238
               + (float)local_2b8._4_4_ + 0.0;
      fVar176 = fVar32 * fStack_250 + fVar79 * fStack_220 + fVar158 * fVar168 +
                (float)uStack_2b0 + 0.0;
      fVar178 = fVar43 * fStack_24c + fVar82 * fStack_21c + fVar161 * fVar174 +
                uStack_2b0._4_4_ + 0.0;
      fVar72 = fVar233 * (float)local_258._0_4_ +
               fVar183 * (float)local_228._0_4_ + fVar214 * fVar135 + (float)local_2c8._0_4_ + 0.0;
      fVar76 = fVar235 * (float)local_258._4_4_ +
               fVar187 * (float)local_228._4_4_ + fVar143 * fVar238 + (float)local_2c8._4_4_ + 0.0;
      fVar79 = fVar237 * fStack_250 + fVar211 * fStack_220 + fVar159 * fVar168 +
               (float)uStack_2c0 + 0.0;
      fVar82 = fVar142 * fStack_24c + fVar212 * fStack_21c + fVar144 * fVar174 +
               uStack_2c0._4_4_ + 0.0;
      fVar135 = fVar157 * (float)local_258._0_4_ +
                fVar185 * (float)local_228._0_4_ + fVar150 * fVar135 + (float)local_298._0_4_ + 0.0;
      fVar238 = fVar160 * (float)local_258._4_4_ +
                fVar189 * (float)local_228._4_4_ + fVar151 * fVar238 + (float)local_298._4_4_ + 0.0;
      fVar168 = fVar162 * fStack_250 + fVar196 * fStack_220 + fVar152 * fVar168 +
                (float)uStack_290 + 0.0;
      fVar174 = fVar180 * fStack_24c + fVar200 * fStack_21c + fVar153 * fVar174 +
                uStack_290._4_4_ + 0.0;
      auVar166._0_4_ = fVar36 * fVar64 - fVar191 * fVar179;
      auVar166._4_4_ = fVar40 * fVar98 - fVar169 * fVar190;
      auVar166._8_4_ = fVar54 * fVar131 - fVar175 * fVar195;
      auVar166._12_4_ = fVar62 * fVar133 - fVar177 * fVar197;
      auVar172._0_4_ = fVar191 * fVar37 - fVar73 * fVar64;
      auVar172._4_4_ = fVar169 * fVar53 - fVar77 * fVar98;
      auVar172._8_4_ = fVar175 * fVar55 - fVar83 * fVar131;
      auVar172._12_4_ = fVar177 * fVar63 - fVar154 * fVar133;
      auVar89._0_4_ = fVar73 * fVar179 - fVar36 * fVar37;
      auVar89._4_4_ = fVar77 * fVar190 - fVar40 * fVar53;
      auVar89._8_4_ = fVar83 * fVar195 - fVar54 * fVar55;
      auVar89._12_4_ = fVar154 * fVar197 - fVar62 * fVar63;
      auVar69._0_4_ = fVar179 * fVar199 - fVar64 * fVar163;
      auVar69._4_4_ = fVar190 * fVar234 - fVar98 * fVar184;
      auVar69._8_4_ = fVar195 * fVar236 - fVar131 * fVar186;
      auVar69._12_4_ = fVar197 * fVar239 - fVar133 * fVar188;
      auVar148._0_4_ = fVar64 * fVar146 - fVar37 * fVar199;
      auVar148._4_4_ = fVar98 * fVar194 - fVar53 * fVar234;
      auVar148._8_4_ = fVar131 * fVar198 - fVar55 * fVar236;
      auVar148._12_4_ = fVar133 * fVar213 - fVar63 * fVar239;
      auVar58._0_4_ = fVar37 * fVar163 - fVar179 * fVar146;
      auVar58._4_4_ = fVar53 * fVar184 - fVar190 * fVar194;
      auVar58._8_4_ = fVar55 * fVar186 - fVar195 * fVar198;
      auVar58._12_4_ = fVar63 * fVar188 - fVar197 * fVar213;
      auVar50._0_4_ = fVar163 * fVar191 - fVar199 * fVar36;
      auVar50._4_4_ = fVar184 * fVar169 - fVar234 * fVar40;
      auVar50._8_4_ = fVar186 * fVar175 - fVar236 * fVar54;
      auVar50._12_4_ = fVar188 * fVar177 - fVar239 * fVar62;
      auVar140._0_4_ = fVar199 * fVar73 - fVar191 * fVar146;
      auVar140._4_4_ = fVar234 * fVar77 - fVar169 * fVar194;
      auVar140._8_4_ = fVar236 * fVar83 - fVar175 * fVar198;
      auVar140._12_4_ = fVar239 * fVar154 - fVar177 * fVar213;
      auVar103._0_4_ = fVar36 * fVar146 - fVar73 * fVar163;
      auVar103._4_4_ = fVar40 * fVar194 - fVar77 * fVar184;
      auVar103._8_4_ = fVar54 * fVar198 - fVar83 * fVar186;
      auVar103._12_4_ = fVar62 * fVar213 - fVar154 * fVar188;
      auVar156._0_4_ = fVar146 * auVar166._0_4_ + fVar163 * auVar172._0_4_ + fVar199 * auVar89._0_4_
      ;
      auVar156._4_4_ = fVar194 * auVar166._4_4_ + fVar184 * auVar172._4_4_ + fVar234 * auVar89._4_4_
      ;
      auVar156._8_4_ = fVar198 * auVar166._8_4_ + fVar186 * auVar172._8_4_ + fVar236 * auVar89._8_4_
      ;
      auVar156._12_4_ =
           fVar213 * auVar166._12_4_ + fVar188 * auVar172._12_4_ + fVar239 * auVar89._12_4_;
      auVar165 = divps(auVar166,auVar156);
      auVar35 = divps(auVar69,auVar156);
      auVar66 = divps(auVar50,auVar156);
      auVar171 = divps(auVar172,auVar156);
      auVar202 = divps(auVar148,auVar156);
      auVar138 = divps(auVar140,auVar156);
      auVar86 = divps(auVar89,auVar156);
      auVar47 = divps(auVar58,auVar156);
      auVar101 = divps(auVar103,auVar156);
      fVar73 = fVar215 * auVar165._0_4_ + fVar72 * auVar171._0_4_ + fVar135 * auVar86._0_4_;
      fVar77 = fVar31 * auVar165._4_4_ + fVar76 * auVar171._4_4_ + fVar238 * auVar86._4_4_;
      fVar80 = fVar176 * auVar165._8_4_ + fVar79 * auVar171._8_4_ + fVar168 * auVar86._8_4_;
      fVar83 = fVar178 * auVar165._12_4_ + fVar82 * auVar171._12_4_ + fVar174 * auVar86._12_4_;
      fVar154 = fVar215 * auVar35._0_4_ + fVar72 * auVar202._0_4_ + fVar135 * auVar47._0_4_;
      fVar32 = fVar31 * auVar35._4_4_ + fVar76 * auVar202._4_4_ + fVar238 * auVar47._4_4_;
      fVar36 = fVar176 * auVar35._8_4_ + fVar79 * auVar202._8_4_ + fVar168 * auVar47._8_4_;
      fVar43 = fVar178 * auVar35._12_4_ + fVar82 * auVar202._12_4_ + fVar174 * auVar47._12_4_;
      fVar215 = fVar215 * auVar66._0_4_ + fVar72 * auVar138._0_4_ + fVar135 * auVar101._0_4_;
      fVar31 = fVar31 * auVar66._4_4_ + fVar76 * auVar138._4_4_ + fVar238 * auVar101._4_4_;
      fVar135 = fVar176 * auVar66._8_4_ + fVar79 * auVar138._8_4_ + fVar168 * auVar101._8_4_;
      fVar238 = fVar178 * auVar66._12_4_ + fVar82 * auVar138._12_4_ + fVar174 * auVar101._12_4_;
    }
    else {
      fVar215 = (pIVar8->super_Geometry).fnumTimeSegments;
      _local_2c8 = ZEXT416((uint)fVar215);
      fVar31 = (pIVar8->super_Geometry).time_range.lower;
      auVar45._0_4_ = (pIVar8->super_Geometry).time_range.upper - fVar31;
      auVar59._4_4_ = fVar215;
      auVar59._0_4_ = fVar215;
      auVar59._8_4_ = fVar215;
      auVar59._12_4_ = fVar215;
      auVar65._0_4_ = *(float *)(ray + 0x70) - fVar31;
      auVar65._4_4_ = *(float *)(ray + 0x74) - fVar31;
      auVar65._8_4_ = *(float *)(ray + 0x78) - fVar31;
      auVar65._12_4_ = *(float *)(ray + 0x7c) - fVar31;
      auVar45._4_4_ = auVar45._0_4_;
      auVar45._8_4_ = auVar45._0_4_;
      auVar45._12_4_ = auVar45._0_4_;
      auVar66 = divps(auVar65,auVar45);
      auVar67._0_4_ = auVar66._0_4_ * fVar215;
      auVar67._4_4_ = auVar66._4_4_ * fVar215;
      auVar67._8_4_ = auVar66._8_4_ * fVar215;
      auVar67._12_4_ = auVar66._12_4_ * fVar215;
      pRVar26 = context;
      auVar66 = auVar67;
      local_288._0_4_ = floorf(auVar67._8_4_);
      uVar24 = SUB84(pRVar26,0);
      local_288._4_4_ = extraout_XMM0_Db;
      uStack_280._0_4_ = (float)extraout_XMM0_Dc;
      uStack_280._4_4_ = (float)extraout_XMM0_Dd;
      local_2b8._0_4_ = floorf(auVar67._12_4_);
      local_2b8._4_4_ = extraout_XMM0_Db_00;
      uStack_2b0._0_4_ = (float)extraout_XMM0_Dc_00;
      uStack_2b0._4_4_ = (float)extraout_XMM0_Dd_00;
      local_2a8._0_4_ = floorf(auVar67._0_4_);
      local_2a8._4_4_ = extraout_XMM0_Db_01;
      uStack_2a0._0_4_ = (float)extraout_XMM0_Dc_01;
      uStack_2a0._4_4_ = (float)extraout_XMM0_Dd_01;
      fVar31 = floorf(auVar67._4_4_);
      auVar46._4_4_ = fVar31;
      auVar46._0_4_ = local_2a8._0_4_;
      auVar46._8_4_ = local_288._0_4_;
      auVar46._12_4_ = local_2b8._0_4_;
      auVar33._0_4_ = fVar215 + -1.0;
      auVar33._4_4_ = auVar33._0_4_;
      auVar33._8_4_ = auVar33._0_4_;
      auVar33._12_4_ = auVar33._0_4_;
      auVar47 = minps(auVar46,auVar33);
      auVar47 = maxps(auVar47,ZEXT816(0));
      auVar216._0_4_ = auVar67._0_4_ - auVar47._0_4_;
      auVar216._4_4_ = auVar67._4_4_ - auVar47._4_4_;
      auVar216._8_4_ = auVar67._8_4_ - auVar47._8_4_;
      auVar216._12_4_ = auVar67._12_4_ - auVar47._12_4_;
      local_108._0_4_ = (undefined4)auVar47._0_4_;
      local_108._4_4_ = (undefined4)auVar47._4_4_;
      local_108._8_4_ = (undefined4)auVar47._8_4_;
      iStack_fc = (int)auVar47._12_4_;
      lVar13 = 0;
      if ((uVar27 & 0xff) != 0) {
        for (; ((uVar27 & 0xff) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      iVar7 = *(int *)(local_108 + lVar13 * 4);
      auVar34._0_4_ = -(uint)(iVar7 == local_108._0_4_);
      auVar34._4_4_ = -(uint)(iVar7 == local_108._4_4_);
      auVar34._8_4_ = -(uint)(iVar7 == local_108._8_4_);
      auVar34._12_4_ = -(uint)(iVar7 == iStack_fc);
      auVar35 = ~auVar34 & auVar44;
      iVar25 = movmskps(uVar24,auVar35);
      if (iVar25 == 0) {
        pAVar10 = pIVar8->local2world;
        pAVar12 = pAVar10 + iVar7;
        fVar215 = (pAVar12->l).vx.field_0.m128[0];
        fVar31 = (pAVar12->l).vx.field_0.m128[1];
        fVar135 = (pAVar12->l).vx.field_0.m128[2];
        pVVar2 = &pAVar10[iVar7].l.vy;
        fVar238 = (pVVar2->field_0).m128[0];
        fVar168 = (pVVar2->field_0).m128[1];
        fVar174 = (pVVar2->field_0).m128[2];
        pVVar2 = &pAVar10[iVar7].l.vz;
        fVar176 = (pVVar2->field_0).m128[0];
        fVar178 = (pVVar2->field_0).m128[1];
        fVar73 = (pVVar2->field_0).m128[2];
        pVVar2 = &pAVar10[iVar7].p;
        fVar77 = (pVVar2->field_0).m128[0];
        fVar80 = (pVVar2->field_0).m128[1];
        fVar83 = (pVVar2->field_0).m128[2];
        pAVar12 = pAVar10 + (long)iVar7 + 1;
        fVar154 = (pAVar12->l).vx.field_0.m128[0];
        fVar32 = (pAVar12->l).vx.field_0.m128[1];
        fVar36 = (pAVar12->l).vx.field_0.m128[2];
        fVar189 = 1.0 - auVar216._0_4_;
        fVar194 = 1.0 - auVar216._4_4_;
        fVar196 = 1.0 - auVar216._8_4_;
        fVar198 = 1.0 - auVar216._12_4_;
        fVar72 = fVar215 * fVar189 + fVar154 * auVar216._0_4_;
        fVar76 = fVar215 * fVar194 + fVar154 * auVar216._4_4_;
        fVar79 = fVar215 * fVar196 + fVar154 * auVar216._8_4_;
        fVar82 = fVar215 * fVar198 + fVar154 * auVar216._12_4_;
        pVVar2 = &pAVar10[(long)iVar7 + 1].l.vy;
        fVar215 = (pVVar2->field_0).m128[0];
        fVar154 = (pVVar2->field_0).m128[1];
        fVar43 = (pVVar2->field_0).m128[2];
        fVar153 = fVar31 * fVar189 + fVar32 * auVar216._0_4_;
        fVar157 = fVar31 * fVar194 + fVar32 * auVar216._4_4_;
        fVar160 = fVar31 * fVar196 + fVar32 * auVar216._8_4_;
        fVar162 = fVar31 * fVar198 + fVar32 * auVar216._12_4_;
        fVar146 = fVar135 * fVar189 + fVar36 * auVar216._0_4_;
        fVar150 = fVar135 * fVar194 + fVar36 * auVar216._4_4_;
        fVar151 = fVar135 * fVar196 + fVar36 * auVar216._8_4_;
        fVar152 = fVar135 * fVar198 + fVar36 * auVar216._12_4_;
        fVar32 = fVar238 * fVar189 + fVar215 * auVar216._0_4_;
        fVar36 = fVar238 * fVar194 + fVar215 * auVar216._4_4_;
        fVar37 = fVar238 * fVar196 + fVar215 * auVar216._8_4_;
        fVar40 = fVar238 * fVar198 + fVar215 * auVar216._12_4_;
        pVVar2 = &pAVar10[(long)iVar7 + 1].l.vz;
        fVar215 = (pVVar2->field_0).m128[0];
        fVar31 = (pVVar2->field_0).m128[1];
        fVar135 = (pVVar2->field_0).m128[2];
        fVar180 = fVar168 * fVar189 + fVar154 * auVar216._0_4_;
        fVar183 = fVar168 * fVar194 + fVar154 * auVar216._4_4_;
        fVar185 = fVar168 * fVar196 + fVar154 * auVar216._8_4_;
        fVar187 = fVar168 * fVar198 + fVar154 * auVar216._12_4_;
        fVar200 = fVar174 * fVar189 + fVar43 * auVar216._0_4_;
        fVar211 = fVar174 * fVar194 + fVar43 * auVar216._4_4_;
        fVar212 = fVar174 * fVar196 + fVar43 * auVar216._8_4_;
        fVar213 = fVar174 * fVar198 + fVar43 * auVar216._12_4_;
        fVar55 = fVar176 * fVar189 + fVar215 * auVar216._0_4_;
        fVar62 = fVar176 * fVar194 + fVar215 * auVar216._4_4_;
        fVar63 = fVar176 * fVar196 + fVar215 * auVar216._8_4_;
        fVar64 = fVar176 * fVar198 + fVar215 * auVar216._12_4_;
        pVVar2 = &pAVar10[(long)iVar7 + 1].p;
        fVar215 = (pVVar2->field_0).m128[0];
        fVar238 = (pVVar2->field_0).m128[1];
        fVar154 = (pVVar2->field_0).m128[2];
        fVar43 = fVar178 * fVar189 + fVar31 * auVar216._0_4_;
        fVar53 = fVar178 * fVar194 + fVar31 * auVar216._4_4_;
        fVar54 = fVar178 * fVar196 + fVar31 * auVar216._8_4_;
        fVar31 = fVar178 * fVar198 + fVar31 * auVar216._12_4_;
        fVar98 = fVar73 * fVar189 + fVar135 * auVar216._0_4_;
        fVar131 = fVar73 * fVar194 + fVar135 * auVar216._4_4_;
        fVar133 = fVar73 * fVar196 + fVar135 * auVar216._8_4_;
        fVar135 = fVar73 * fVar198 + fVar135 * auVar216._12_4_;
        fVar168 = fVar77 * fVar189 + fVar215 * auVar216._0_4_;
        fVar174 = fVar77 * fVar194 + fVar215 * auVar216._4_4_;
        fVar176 = fVar77 * fVar196 + fVar215 * auVar216._8_4_;
        fVar178 = fVar77 * fVar198 + fVar215 * auVar216._12_4_;
        fVar214 = fVar80 * fVar189 + fVar238 * auVar216._0_4_;
        fVar233 = fVar80 * fVar194 + fVar238 * auVar216._4_4_;
        fVar235 = fVar80 * fVar196 + fVar238 * auVar216._8_4_;
        fVar237 = fVar80 * fVar198 + fVar238 * auVar216._12_4_;
        fVar189 = fVar189 * fVar83 + fVar154 * auVar216._0_4_;
        fVar194 = fVar194 * fVar83 + fVar154 * auVar216._4_4_;
        fVar196 = fVar196 * fVar83 + fVar154 * auVar216._8_4_;
        fVar198 = fVar198 * fVar83 + fVar154 * auVar216._12_4_;
        auVar164._0_4_ = fVar180 * fVar98 - fVar200 * fVar43;
        auVar164._4_4_ = fVar183 * fVar131 - fVar211 * fVar53;
        auVar164._8_4_ = fVar185 * fVar133 - fVar212 * fVar54;
        auVar164._12_4_ = fVar187 * fVar135 - fVar213 * fVar31;
        auVar170._0_4_ = fVar200 * fVar55 - fVar32 * fVar98;
        auVar170._4_4_ = fVar211 * fVar62 - fVar36 * fVar131;
        auVar170._8_4_ = fVar212 * fVar63 - fVar37 * fVar133;
        auVar170._12_4_ = fVar213 * fVar64 - fVar40 * fVar135;
        auVar85._0_4_ = fVar32 * fVar43 - fVar180 * fVar55;
        auVar85._4_4_ = fVar36 * fVar53 - fVar183 * fVar62;
        auVar85._8_4_ = fVar37 * fVar54 - fVar185 * fVar63;
        auVar85._12_4_ = fVar40 * fVar31 - fVar187 * fVar64;
        auVar68._0_4_ = fVar146 * fVar43 - fVar153 * fVar98;
        auVar68._4_4_ = fVar150 * fVar53 - fVar157 * fVar131;
        auVar68._8_4_ = fVar151 * fVar54 - fVar160 * fVar133;
        auVar68._12_4_ = fVar152 * fVar31 - fVar162 * fVar135;
        auVar201._4_4_ = fVar131 * fVar76 - fVar150 * fVar62;
        auVar201._0_4_ = fVar98 * fVar72 - fVar146 * fVar55;
        auVar56._0_4_ = fVar55 * fVar153 - fVar43 * fVar72;
        auVar56._4_4_ = fVar62 * fVar157 - fVar53 * fVar76;
        auVar56._8_4_ = fVar63 * fVar160 - fVar54 * fVar79;
        auVar56._12_4_ = fVar64 * fVar162 - fVar31 * fVar82;
        auVar48._0_4_ = fVar153 * fVar200 - fVar146 * fVar180;
        auVar48._4_4_ = fVar157 * fVar211 - fVar150 * fVar183;
        auVar48._8_4_ = fVar160 * fVar212 - fVar151 * fVar185;
        auVar48._12_4_ = fVar162 * fVar213 - fVar152 * fVar187;
        auVar137._0_4_ = fVar146 * fVar32 - fVar200 * fVar72;
        auVar137._4_4_ = fVar150 * fVar36 - fVar211 * fVar76;
        auVar137._8_4_ = fVar151 * fVar37 - fVar212 * fVar79;
        auVar137._12_4_ = fVar152 * fVar40 - fVar213 * fVar82;
        auVar100._4_4_ = fVar183 * fVar76 - fVar36 * fVar157;
        auVar100._0_4_ = fVar180 * fVar72 - fVar32 * fVar153;
        auVar201._8_4_ = fVar133 * fVar79 - fVar151 * fVar63;
        auVar201._12_4_ = fVar135 * fVar82 - fVar152 * fVar64;
        auVar100._8_4_ = fVar185 * fVar79 - fVar37 * fVar160;
        auVar100._12_4_ = fVar187 * fVar82 - fVar40 * fVar162;
        auVar75._0_4_ = fVar72 * auVar164._0_4_ + fVar153 * auVar170._0_4_ + fVar146 * auVar85._0_4_
        ;
        auVar75._4_4_ = fVar76 * auVar164._4_4_ + fVar157 * auVar170._4_4_ + fVar150 * auVar85._4_4_
        ;
        auVar75._8_4_ = fVar79 * auVar164._8_4_ + fVar160 * auVar170._8_4_ + fVar151 * auVar85._8_4_
        ;
        auVar75._12_4_ =
             fVar82 * auVar164._12_4_ + fVar162 * auVar170._12_4_ + fVar152 * auVar85._12_4_;
        auVar165 = divps(auVar164,auVar75);
        auVar35 = divps(auVar68,auVar75);
        auVar66 = divps(auVar48,auVar75);
        auVar171 = divps(auVar170,auVar75);
        auVar202 = divps(auVar201,auVar75);
        auVar138 = divps(auVar137,auVar75);
        auVar86 = divps(auVar85,auVar75);
        auVar47 = divps(auVar56,auVar75);
        auVar101 = divps(auVar100,auVar75);
        fVar215 = fVar214 * auVar138._0_4_ + fVar189 * auVar101._0_4_;
        fVar31 = fVar233 * auVar138._4_4_ + fVar194 * auVar101._4_4_;
        fVar135 = fVar235 * auVar138._8_4_ + fVar196 * auVar101._8_4_;
        fVar238 = fVar237 * auVar138._12_4_ + fVar198 * auVar101._12_4_;
        fVar73 = fVar168 * auVar165._0_4_ + fVar214 * auVar171._0_4_ + fVar189 * auVar86._0_4_;
        fVar77 = fVar174 * auVar165._4_4_ + fVar233 * auVar171._4_4_ + fVar194 * auVar86._4_4_;
        fVar80 = fVar176 * auVar165._8_4_ + fVar235 * auVar171._8_4_ + fVar196 * auVar86._8_4_;
        fVar83 = fVar178 * auVar165._12_4_ + fVar237 * auVar171._12_4_ + fVar198 * auVar86._12_4_;
        fVar154 = fVar168 * auVar35._0_4_ + fVar214 * auVar202._0_4_ + fVar189 * auVar47._0_4_;
        fVar32 = fVar174 * auVar35._4_4_ + fVar233 * auVar202._4_4_ + fVar194 * auVar47._4_4_;
        fVar36 = fVar176 * auVar35._8_4_ + fVar235 * auVar202._8_4_ + fVar196 * auVar47._8_4_;
        fVar43 = fVar178 * auVar35._12_4_ + fVar237 * auVar202._12_4_ + fVar198 * auVar47._12_4_;
      }
      else {
        auVar86 = _local_108;
        if (uVar27 != 0) {
          pAVar12 = pIVar8->local2world;
          _local_218 = auVar47;
          _local_1c8 = in_XMM4;
          _local_1b8 = in_XMM8;
          _local_2c8 = in_XMM9;
          auVar101 = auVar44;
          in_XMM13 = auVar216;
          do {
            lVar13 = 0;
            if ((uVar27 & 0xf) != 0) {
              for (; ((uVar27 & 0xf) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            iVar7 = *(int *)(local_108 + (long)(int)lVar13 * 4);
            auVar181._0_4_ = -(uint)(iVar7 == local_108._0_4_);
            auVar181._4_4_ = -(uint)(iVar7 == local_108._4_4_);
            auVar181._8_4_ = -(uint)(iVar7 == local_108._8_4_);
            auVar181._12_4_ = -(uint)(iVar7 == iStack_fc);
            auVar181 = auVar181 & auVar101;
            pAVar10 = pAVar12 + iVar7;
            uVar24 = *(undefined4 *)&(pAVar10->l).vx.field_0;
            uVar14 = *(undefined4 *)((long)&(pAVar10->l).vx.field_0 + 4);
            uVar15 = *(undefined4 *)((long)&(pAVar10->l).vx.field_0 + 8);
            auVar217._4_4_ = uVar24;
            auVar217._0_4_ = uVar24;
            auVar217._8_4_ = uVar24;
            auVar217._12_4_ = uVar24;
            in_XMM13 = ~auVar181 & in_XMM13 | auVar217 & auVar181;
            auVar218._4_4_ = uVar14;
            auVar218._0_4_ = uVar14;
            auVar218._8_4_ = uVar14;
            auVar218._12_4_ = uVar14;
            in_XMM8 = ~auVar181 & _local_248 | auVar218 & auVar181;
            auVar203._4_4_ = uVar15;
            auVar203._0_4_ = uVar15;
            auVar203._8_4_ = uVar15;
            auVar203._12_4_ = uVar15;
            in_XMM4 = ~auVar181 & _local_298 | auVar203 & auVar181;
            pVVar2 = &pAVar12[iVar7].l.vy;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            auVar219._4_4_ = uVar24;
            auVar219._0_4_ = uVar24;
            auVar219._8_4_ = uVar24;
            auVar219._12_4_ = uVar24;
            in_XMM9 = ~auVar181 & _local_268 | auVar219 & auVar181;
            auVar220._4_4_ = uVar14;
            auVar220._0_4_ = uVar14;
            auVar220._8_4_ = uVar14;
            auVar220._12_4_ = uVar14;
            auVar47 = ~auVar181 & _local_2a8 | auVar220 & auVar181;
            auVar204._4_4_ = uVar15;
            auVar204._0_4_ = uVar15;
            auVar204._8_4_ = uVar15;
            auVar204._12_4_ = uVar15;
            _local_2b8 = ~auVar181 & _local_2b8 | auVar204 & auVar181;
            pVVar2 = &pAVar12[iVar7].l.vz;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            auVar221._4_4_ = uVar24;
            auVar221._0_4_ = uVar24;
            auVar221._8_4_ = uVar24;
            auVar221._12_4_ = uVar24;
            auVar59 = ~auVar181 & auVar59 | auVar221 & auVar181;
            auVar222._4_4_ = uVar14;
            auVar222._0_4_ = uVar14;
            auVar222._8_4_ = uVar14;
            auVar222._12_4_ = uVar14;
            _local_238 = ~auVar181 & _local_238 | auVar222 & auVar181;
            auVar205._4_4_ = uVar15;
            auVar205._0_4_ = uVar15;
            auVar205._8_4_ = uVar15;
            auVar205._12_4_ = uVar15;
            _local_288 = ~auVar181 & _local_288 | auVar205 & auVar181;
            pVVar2 = &pAVar12[iVar7].p;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            auVar223._4_4_ = uVar24;
            auVar223._0_4_ = uVar24;
            auVar223._8_4_ = uVar24;
            auVar223._12_4_ = uVar24;
            auVar35 = ~auVar181 & auVar35 | auVar223 & auVar181;
            auVar224._4_4_ = uVar14;
            auVar224._0_4_ = uVar14;
            auVar224._8_4_ = uVar14;
            auVar224._12_4_ = uVar14;
            _local_1f8 = ~auVar181 & _local_1f8 | auVar224 & auVar181;
            auVar206._4_4_ = uVar15;
            auVar206._0_4_ = uVar15;
            auVar206._8_4_ = uVar15;
            auVar206._12_4_ = uVar15;
            _local_228 = ~auVar181 & _local_228 | auVar206 & auVar181;
            pAVar10 = pAVar12 + (long)iVar7 + 1;
            uVar24 = *(undefined4 *)&(pAVar10->l).vx.field_0;
            uVar14 = *(undefined4 *)((long)&(pAVar10->l).vx.field_0 + 4);
            uVar15 = *(undefined4 *)((long)&(pAVar10->l).vx.field_0 + 8);
            auVar225._4_4_ = uVar24;
            auVar225._0_4_ = uVar24;
            auVar225._8_4_ = uVar24;
            auVar225._12_4_ = uVar24;
            in_XMM10 = ~auVar181 & in_XMM10 | auVar225 & auVar181;
            auVar226._4_4_ = uVar14;
            auVar226._0_4_ = uVar14;
            auVar226._8_4_ = uVar14;
            auVar226._12_4_ = uVar14;
            in_XMM5 = ~auVar181 & in_XMM5 | auVar226 & auVar181;
            auVar207._4_4_ = uVar15;
            auVar207._0_4_ = uVar15;
            auVar207._8_4_ = uVar15;
            auVar207._12_4_ = uVar15;
            auVar66 = ~auVar181 & auVar66 | auVar207 & auVar181;
            pVVar2 = &pAVar12[(long)iVar7 + 1].l.vy;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            auVar227._4_4_ = uVar24;
            auVar227._0_4_ = uVar24;
            auVar227._8_4_ = uVar24;
            auVar227._12_4_ = uVar24;
            in_XMM6 = ~auVar181 & in_XMM6 | auVar227 & auVar181;
            auVar228._4_4_ = uVar14;
            auVar228._0_4_ = uVar14;
            auVar228._8_4_ = uVar14;
            auVar228._12_4_ = uVar14;
            in_XMM7 = ~auVar181 & in_XMM7 | auVar228 & auVar181;
            auVar208._4_4_ = uVar15;
            auVar208._0_4_ = uVar15;
            auVar208._8_4_ = uVar15;
            auVar208._12_4_ = uVar15;
            _local_1c8 = ~auVar181 & _local_1c8 | auVar208 & auVar181;
            pVVar2 = &pAVar12[(long)iVar7 + 1].l.vz;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            auVar229._4_4_ = uVar24;
            auVar229._0_4_ = uVar24;
            auVar229._8_4_ = uVar24;
            auVar229._12_4_ = uVar24;
            _local_1b8 = ~auVar181 & _local_1b8 | auVar229 & auVar181;
            auVar230._4_4_ = uVar14;
            auVar230._0_4_ = uVar14;
            auVar230._8_4_ = uVar14;
            auVar230._12_4_ = uVar14;
            _local_218 = ~auVar181 & _local_218 | auVar230 & auVar181;
            auVar209._4_4_ = uVar15;
            auVar209._0_4_ = uVar15;
            auVar209._8_4_ = uVar15;
            auVar209._12_4_ = uVar15;
            _local_2c8 = ~auVar181 & _local_2c8 | auVar209 & auVar181;
            pVVar2 = &pAVar12[(long)iVar7 + 1].p;
            uVar24 = *(undefined4 *)&pVVar2->field_0;
            uVar14 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
            uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
            auVar231._4_4_ = uVar24;
            auVar231._0_4_ = uVar24;
            auVar231._8_4_ = uVar24;
            auVar231._12_4_ = uVar24;
            _local_1e8 = ~auVar181 & _local_1e8 | auVar231 & auVar181;
            auVar232._4_4_ = uVar14;
            auVar232._0_4_ = uVar14;
            auVar232._8_4_ = uVar14;
            auVar232._12_4_ = uVar14;
            _local_278 = ~auVar181 & _local_278 | auVar232 & auVar181;
            auVar101 = auVar101 ^ auVar181;
            auVar192._4_4_ = uVar15;
            auVar192._0_4_ = uVar15;
            auVar192._8_4_ = uVar15;
            auVar192._12_4_ = uVar15;
            in_XMM12 = ~auVar181 & in_XMM12 | auVar192 & auVar181;
            uVar27 = movmskps(uVar27,auVar101);
            auVar86 = auVar66;
            in_XMM14 = in_XMM7;
            _local_2a8 = auVar47;
            _local_298 = in_XMM4;
            _local_268 = in_XMM9;
            _local_258 = in_XMM12;
            _local_248 = in_XMM8;
          } while (uVar27 != 0);
        }
        fVar150 = 1.0 - auVar216._0_4_;
        fVar151 = 1.0 - auVar216._4_4_;
        fVar152 = 1.0 - auVar216._8_4_;
        fVar153 = 1.0 - auVar216._12_4_;
        fVar157 = in_XMM13._0_4_ * fVar150 + in_XMM10._0_4_ * auVar216._0_4_;
        fVar160 = in_XMM13._4_4_ * fVar151 + in_XMM10._4_4_ * auVar216._4_4_;
        fVar162 = in_XMM13._8_4_ * fVar152 + in_XMM10._8_4_ * auVar216._8_4_;
        fVar180 = in_XMM13._12_4_ * fVar153 + in_XMM10._12_4_ * auVar216._12_4_;
        fVar72 = in_XMM8._0_4_ * fVar150 + in_XMM5._0_4_ * auVar216._0_4_;
        fVar76 = in_XMM8._4_4_ * fVar151 + in_XMM5._4_4_ * auVar216._4_4_;
        fVar79 = in_XMM8._8_4_ * fVar152 + in_XMM5._8_4_ * auVar216._8_4_;
        fVar82 = in_XMM8._12_4_ * fVar153 + in_XMM5._12_4_ * auVar216._12_4_;
        fVar55 = in_XMM4._0_4_ * fVar150 + auVar86._0_4_ * auVar216._0_4_;
        fVar62 = in_XMM4._4_4_ * fVar151 + auVar86._4_4_ * auVar216._4_4_;
        fVar63 = in_XMM4._8_4_ * fVar152 + auVar86._8_4_ * auVar216._8_4_;
        fVar64 = in_XMM4._12_4_ * fVar153 + auVar86._12_4_ * auVar216._12_4_;
        fVar98 = in_XMM9._0_4_ * fVar150 + in_XMM6._0_4_ * auVar216._0_4_;
        fVar131 = in_XMM9._4_4_ * fVar151 + in_XMM6._4_4_ * auVar216._4_4_;
        fVar133 = in_XMM9._8_4_ * fVar152 + in_XMM6._8_4_ * auVar216._8_4_;
        fVar146 = in_XMM9._12_4_ * fVar153 + in_XMM6._12_4_ * auVar216._12_4_;
        fVar215 = auVar47._0_4_ * fVar150 + in_XMM14._0_4_ * auVar216._0_4_;
        fVar135 = auVar47._4_4_ * fVar151 + in_XMM14._4_4_ * auVar216._4_4_;
        fVar73 = auVar47._8_4_ * fVar152 + in_XMM14._8_4_ * auVar216._8_4_;
        fVar80 = auVar47._12_4_ * fVar153 + in_XMM14._12_4_ * auVar216._12_4_;
        fVar37 = (float)local_2b8._0_4_ * fVar150 + (float)local_1c8._0_4_ * auVar216._0_4_;
        fVar40 = (float)local_2b8._4_4_ * fVar151 + (float)local_1c8._4_4_ * auVar216._4_4_;
        fVar53 = (float)uStack_2b0 * fVar152 + fStack_1c0 * auVar216._8_4_;
        fVar54 = uStack_2b0._4_4_ * fVar153 + fStack_1bc * auVar216._12_4_;
        fVar154 = auVar59._0_4_ * fVar150 + (float)local_1b8._0_4_ * auVar216._0_4_;
        fVar32 = auVar59._4_4_ * fVar151 + (float)local_1b8._4_4_ * auVar216._4_4_;
        fVar36 = auVar59._8_4_ * fVar152 + fStack_1b0 * auVar216._8_4_;
        fVar43 = auVar59._12_4_ * fVar153 + fStack_1ac * auVar216._12_4_;
        fVar31 = (float)local_238._0_4_ * fVar150 + (float)local_218._0_4_ * auVar216._0_4_;
        fVar238 = (float)local_238._4_4_ * fVar151 + (float)local_218._4_4_ * auVar216._4_4_;
        fVar77 = fStack_230 * fVar152 + fStack_210 * auVar216._8_4_;
        fVar83 = fStack_22c * fVar153 + fStack_20c * auVar216._12_4_;
        fVar183 = (float)local_288._0_4_ * fVar150 + (float)local_2c8._0_4_ * auVar216._0_4_;
        fVar185 = (float)local_288._4_4_ * fVar151 + (float)local_2c8._4_4_ * auVar216._4_4_;
        fVar187 = (float)uStack_280 * fVar152 + (float)uStack_2c0 * auVar216._8_4_;
        fVar189 = uStack_280._4_4_ * fVar153 + uStack_2c0._4_4_ * auVar216._12_4_;
        fVar168 = auVar35._0_4_ * fVar150 + (float)local_1e8._0_4_ * auVar216._0_4_;
        fVar174 = auVar35._4_4_ * fVar151 + (float)local_1e8._4_4_ * auVar216._4_4_;
        fVar176 = auVar35._8_4_ * fVar152 + fStack_1e0 * auVar216._8_4_;
        fVar178 = auVar35._12_4_ * fVar153 + fStack_1dc * auVar216._12_4_;
        fVar194 = (float)local_1f8._0_4_ * fVar150 + (float)local_278._0_4_ * auVar216._0_4_;
        fVar196 = (float)local_1f8._4_4_ * fVar151 + (float)local_278._4_4_ * auVar216._4_4_;
        fVar198 = fStack_1f0 * fVar152 + fStack_270 * auVar216._8_4_;
        fVar200 = fStack_1ec * fVar153 + fStack_26c * auVar216._12_4_;
        fVar150 = fVar150 * (float)local_228._0_4_ + (float)local_258._0_4_ * auVar216._0_4_;
        fVar151 = fVar151 * (float)local_228._4_4_ + (float)local_258._4_4_ * auVar216._4_4_;
        fVar152 = fVar152 * fStack_220 + fStack_250 * auVar216._8_4_;
        fVar153 = fVar153 * fStack_21c + fStack_24c * auVar216._12_4_;
        auVar167._0_4_ = fVar215 * fVar183 - fVar37 * fVar31;
        auVar167._4_4_ = fVar135 * fVar185 - fVar40 * fVar238;
        auVar167._8_4_ = fVar73 * fVar187 - fVar53 * fVar77;
        auVar167._12_4_ = fVar80 * fVar189 - fVar54 * fVar83;
        auVar173._0_4_ = fVar37 * fVar154 - fVar98 * fVar183;
        auVar173._4_4_ = fVar40 * fVar32 - fVar131 * fVar185;
        auVar173._8_4_ = fVar53 * fVar36 - fVar133 * fVar187;
        auVar173._12_4_ = fVar54 * fVar43 - fVar146 * fVar189;
        auVar90._0_4_ = fVar98 * fVar31 - fVar215 * fVar154;
        auVar90._4_4_ = fVar131 * fVar238 - fVar135 * fVar32;
        auVar90._8_4_ = fVar133 * fVar77 - fVar73 * fVar36;
        auVar90._12_4_ = fVar146 * fVar83 - fVar80 * fVar43;
        auVar70._0_4_ = fVar55 * fVar31 - fVar72 * fVar183;
        auVar70._4_4_ = fVar62 * fVar238 - fVar76 * fVar185;
        auVar70._8_4_ = fVar63 * fVar77 - fVar79 * fVar187;
        auVar70._12_4_ = fVar64 * fVar83 - fVar82 * fVar189;
        auVar210._0_4_ = fVar183 * fVar157 - fVar55 * fVar154;
        auVar210._4_4_ = fVar185 * fVar160 - fVar62 * fVar32;
        auVar210._8_4_ = fVar187 * fVar162 - fVar63 * fVar36;
        auVar210._12_4_ = fVar189 * fVar180 - fVar64 * fVar43;
        auVar60._0_4_ = fVar154 * fVar72 - fVar31 * fVar157;
        auVar60._4_4_ = fVar32 * fVar76 - fVar238 * fVar160;
        auVar60._8_4_ = fVar36 * fVar79 - fVar77 * fVar162;
        auVar60._12_4_ = fVar43 * fVar82 - fVar83 * fVar180;
        auVar51._0_4_ = fVar72 * fVar37 - fVar55 * fVar215;
        auVar51._4_4_ = fVar76 * fVar40 - fVar62 * fVar135;
        auVar51._8_4_ = fVar79 * fVar53 - fVar63 * fVar73;
        auVar51._12_4_ = fVar82 * fVar54 - fVar64 * fVar80;
        auVar141._0_4_ = fVar55 * fVar98 - fVar37 * fVar157;
        auVar141._4_4_ = fVar62 * fVar131 - fVar40 * fVar160;
        auVar141._8_4_ = fVar63 * fVar133 - fVar53 * fVar162;
        auVar141._12_4_ = fVar64 * fVar146 - fVar54 * fVar180;
        auVar104._0_4_ = fVar215 * fVar157 - fVar98 * fVar72;
        auVar104._4_4_ = fVar135 * fVar160 - fVar131 * fVar76;
        auVar104._8_4_ = fVar73 * fVar162 - fVar133 * fVar79;
        auVar104._12_4_ = fVar80 * fVar180 - fVar146 * fVar82;
        auVar193._0_4_ = fVar157 * auVar167._0_4_ + fVar72 * auVar173._0_4_ + fVar55 * auVar90._0_4_
        ;
        auVar193._4_4_ = fVar160 * auVar167._4_4_ + fVar76 * auVar173._4_4_ + fVar62 * auVar90._4_4_
        ;
        auVar193._8_4_ = fVar162 * auVar167._8_4_ + fVar79 * auVar173._8_4_ + fVar63 * auVar90._8_4_
        ;
        auVar193._12_4_ =
             fVar180 * auVar167._12_4_ + fVar82 * auVar173._12_4_ + fVar64 * auVar90._12_4_;
        auVar165 = divps(auVar167,auVar193);
        auVar35 = divps(auVar70,auVar193);
        auVar66 = divps(auVar51,auVar193);
        auVar171 = divps(auVar173,auVar193);
        auVar202 = divps(auVar210,auVar193);
        auVar138 = divps(auVar141,auVar193);
        auVar86 = divps(auVar90,auVar193);
        auVar47 = divps(auVar60,auVar193);
        auVar101 = divps(auVar104,auVar193);
        fVar215 = fVar194 * auVar138._0_4_ + fVar150 * auVar101._0_4_;
        fVar31 = fVar196 * auVar138._4_4_ + fVar151 * auVar101._4_4_;
        fVar135 = fVar198 * auVar138._8_4_ + fVar152 * auVar101._8_4_;
        fVar238 = fVar200 * auVar138._12_4_ + fVar153 * auVar101._12_4_;
        fVar73 = fVar168 * auVar165._0_4_ + fVar194 * auVar171._0_4_ + fVar150 * auVar86._0_4_;
        fVar77 = fVar174 * auVar165._4_4_ + fVar196 * auVar171._4_4_ + fVar151 * auVar86._4_4_;
        fVar80 = fVar176 * auVar165._8_4_ + fVar198 * auVar171._8_4_ + fVar152 * auVar86._8_4_;
        fVar83 = fVar178 * auVar165._12_4_ + fVar200 * auVar171._12_4_ + fVar153 * auVar86._12_4_;
        fVar154 = fVar168 * auVar35._0_4_ + fVar194 * auVar202._0_4_ + fVar150 * auVar47._0_4_;
        fVar32 = fVar174 * auVar35._4_4_ + fVar196 * auVar202._4_4_ + fVar151 * auVar47._4_4_;
        fVar36 = fVar176 * auVar35._8_4_ + fVar198 * auVar202._8_4_ + fVar152 * auVar47._8_4_;
        fVar43 = fVar178 * auVar35._12_4_ + fVar200 * auVar202._12_4_ + fVar153 * auVar47._12_4_;
      }
      fVar215 = fVar168 * auVar66._0_4_ + fVar215;
      fVar31 = fVar174 * auVar66._4_4_ + fVar31;
      fVar135 = fVar176 * auVar66._8_4_ + fVar135;
      fVar238 = fVar178 * auVar66._12_4_ + fVar238;
    }
    pRVar1 = ray + 0x10;
    fVar168 = *(float *)pRVar1;
    fVar174 = *(float *)(ray + 0x14);
    fVar176 = *(float *)(ray + 0x18);
    auVar18 = *(undefined1 (*) [12])pRVar1;
    fVar178 = *(float *)(ray + 0x1c);
    auVar91 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x20;
    fVar37 = *(float *)pRVar1;
    fVar40 = *(float *)(ray + 0x24);
    fVar53 = *(float *)(ray + 0x28);
    auVar19 = *(undefined1 (*) [12])pRVar1;
    fVar54 = *(float *)(ray + 0x2c);
    auVar92 = *(undefined1 (*) [16])pRVar1;
    fVar55 = *(float *)ray;
    fVar62 = *(float *)(ray + 4);
    fVar63 = *(float *)(ray + 8);
    auVar20 = *(undefined1 (*) [12])ray;
    fVar64 = *(float *)(ray + 0xc);
    auVar93 = *(undefined1 (*) [16])ray;
    pRVar1 = ray + 0x40;
    fVar72 = *(float *)pRVar1;
    fVar76 = *(float *)(ray + 0x44);
    fVar79 = *(float *)(ray + 0x48);
    auVar23 = *(undefined1 (*) [12])pRVar1;
    fVar82 = *(float *)(ray + 0x4c);
    auVar105 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x50;
    fVar98 = *(float *)pRVar1;
    fVar131 = *(float *)(ray + 0x54);
    fVar133 = *(float *)(ray + 0x58);
    auVar22 = *(undefined1 (*) [12])pRVar1;
    fVar146 = *(float *)(ray + 0x5c);
    auVar95 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x60;
    fVar150 = *(float *)pRVar1;
    fVar151 = *(float *)(ray + 100);
    fVar152 = *(float *)(ray + 0x68);
    auVar21 = *(undefined1 (*) [12])pRVar1;
    fVar153 = *(float *)(ray + 0x6c);
    auVar94 = *(undefined1 (*) [16])pRVar1;
    *(float *)ray =
         auVar165._0_4_ * fVar55 + auVar171._0_4_ * fVar168 + auVar86._0_4_ * fVar37 + -fVar73;
    *(float *)(ray + 4) =
         auVar165._4_4_ * fVar62 + auVar171._4_4_ * fVar174 + auVar86._4_4_ * fVar40 + -fVar77;
    *(float *)(ray + 8) =
         auVar165._8_4_ * fVar63 + auVar171._8_4_ * fVar176 + auVar86._8_4_ * fVar53 + -fVar80;
    *(float *)(ray + 0xc) =
         auVar165._12_4_ * fVar64 + auVar171._12_4_ * fVar178 + auVar86._12_4_ * fVar54 + -fVar83;
    *(float *)(ray + 0x10) =
         auVar35._0_4_ * fVar55 + auVar202._0_4_ * fVar168 + auVar47._0_4_ * fVar37 + -fVar154;
    *(float *)(ray + 0x14) =
         auVar35._4_4_ * fVar62 + auVar202._4_4_ * fVar174 + auVar47._4_4_ * fVar40 + -fVar32;
    *(float *)(ray + 0x18) =
         auVar35._8_4_ * fVar63 + auVar202._8_4_ * fVar176 + auVar47._8_4_ * fVar53 + -fVar36;
    *(float *)(ray + 0x1c) =
         auVar35._12_4_ * fVar64 + auVar202._12_4_ * fVar178 + auVar47._12_4_ * fVar54 + -fVar43;
    *(float *)(ray + 0x20) =
         auVar66._0_4_ * fVar55 + auVar138._0_4_ * fVar168 + auVar101._0_4_ * fVar37 + -fVar215;
    *(float *)(ray + 0x24) =
         auVar66._4_4_ * fVar62 + auVar138._4_4_ * fVar174 + auVar101._4_4_ * fVar40 + -fVar31;
    *(float *)(ray + 0x28) =
         auVar66._8_4_ * fVar63 + auVar138._8_4_ * fVar176 + auVar101._8_4_ * fVar53 + -fVar135;
    *(float *)(ray + 0x2c) =
         auVar66._12_4_ * fVar64 + auVar138._12_4_ * fVar178 + auVar101._12_4_ * fVar54 + -fVar238;
    *(float *)(ray + 0x40) =
         auVar165._0_4_ * fVar72 + auVar171._0_4_ * fVar98 + auVar86._0_4_ * fVar150;
    *(float *)(ray + 0x44) =
         auVar165._4_4_ * fVar76 + auVar171._4_4_ * fVar131 + auVar86._4_4_ * fVar151;
    *(float *)(ray + 0x48) =
         auVar165._8_4_ * fVar79 + auVar171._8_4_ * fVar133 + auVar86._8_4_ * fVar152;
    *(float *)(ray + 0x4c) =
         auVar165._12_4_ * fVar82 + auVar171._12_4_ * fVar146 + auVar86._12_4_ * fVar153;
    *(float *)(ray + 0x50) =
         auVar35._0_4_ * fVar72 + auVar202._0_4_ * fVar98 + auVar47._0_4_ * fVar150;
    *(float *)(ray + 0x54) =
         auVar35._4_4_ * fVar76 + auVar202._4_4_ * fVar131 + auVar47._4_4_ * fVar151;
    *(float *)(ray + 0x58) =
         auVar35._8_4_ * fVar79 + auVar202._8_4_ * fVar133 + auVar47._8_4_ * fVar152;
    *(float *)(ray + 0x5c) =
         auVar35._12_4_ * fVar82 + auVar202._12_4_ * fVar146 + auVar47._12_4_ * fVar153;
    *(float *)(ray + 0x60) =
         auVar66._0_4_ * fVar72 + auVar138._0_4_ * fVar98 + auVar101._0_4_ * fVar150;
    *(float *)(ray + 100) =
         auVar66._4_4_ * fVar76 + auVar138._4_4_ * fVar131 + auVar101._4_4_ * fVar151;
    *(float *)(ray + 0x68) =
         auVar66._8_4_ * fVar79 + auVar138._8_4_ * fVar133 + auVar101._8_4_ * fVar152;
    *(float *)(ray + 0x6c) =
         auVar66._12_4_ * fVar82 + auVar138._12_4_ * fVar146 + auVar101._12_4_ * fVar153;
    local_108._0_8_ = *(undefined8 *)&(pIVar8->super_Geometry).field_0x58;
    local_f8 = context->args;
    local_128 = auVar44._0_8_;
    uStack_120 = auVar44._8_8_;
    local_38 = local_128;
    uStack_30 = uStack_120;
    stack0xffffffffffffff00 = pRVar9;
    (**(code **)(local_108._0_8_ + 0x98))(&local_38,local_108._0_8_ + 0x58,ray);
    local_288 = auVar20._0_8_;
    uStack_280 = auVar93._8_8_;
    *(undefined1 (*) [8])ray = local_288;
    *(undefined8 *)(ray + 8) = uStack_280;
    local_2c8 = auVar18._0_8_;
    uStack_2c0 = auVar91._8_8_;
    *(undefined1 (*) [8])(ray + 0x10) = local_2c8;
    *(undefined8 *)(ray + 0x18) = uStack_2c0;
    local_2d8 = auVar19._0_8_;
    uStack_2d0 = auVar92._8_8_;
    *(undefined8 *)(ray + 0x20) = local_2d8;
    *(undefined8 *)(ray + 0x28) = uStack_2d0;
    local_298 = auVar23._0_8_;
    uStack_290 = auVar105._8_8_;
    *(undefined1 (*) [8])(ray + 0x40) = local_298;
    *(undefined8 *)(ray + 0x48) = uStack_290;
    local_2a8 = auVar22._0_8_;
    uStack_2a0 = auVar95._8_8_;
    *(undefined1 (*) [8])(ray + 0x50) = local_2a8;
    *(undefined8 *)(ray + 0x58) = uStack_2a0;
    local_2b8 = auVar21._0_8_;
    uStack_2b0 = auVar94._8_8_;
    *(undefined1 (*) [8])(ray + 0x60) = local_2b8;
    *(undefined8 *)(ray + 0x68) = uStack_2b0;
    pRVar9->instID[0] = 0xffffffff;
    pRVar9->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      vbool<K> valid = valid_i;
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }